

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_broadcast_outer(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined3 uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  int in_EAX;
  uint uVar77;
  int iVar78;
  Mat *pMVar79;
  Mat *extraout_RAX;
  Mat *extraout_RAX_00;
  Mat *extraout_RAX_01;
  Mat *extraout_RAX_02;
  Mat *extraout_RAX_03;
  Mat *extraout_RAX_04;
  ulong uVar80;
  Mat *extraout_RAX_05;
  Mat *extraout_RAX_06;
  int iVar81;
  ulong uVar82;
  int iVar83;
  void **ppvVar84;
  uint uVar85;
  uint *puVar86;
  undefined4 *puVar87;
  int iVar88;
  int iVar89;
  long lVar90;
  uint uVar91;
  long lVar92;
  undefined1 (*pauVar93) [64];
  float *pfVar94;
  undefined1 (*pauVar95) [64];
  float *pfVar96;
  undefined1 (*pauVar97) [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  __m512 afVar125;
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar130;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [56];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar164 [64];
  __m128 afVar165;
  binary_op_ratan2 op;
  __m256 _b;
  __m256 _p;
  binary_op_ratan2 local_164;
  char local_163;
  char local_162;
  char local_161;
  ulong local_160;
  Mat *local_158;
  ulong local_150;
  long local_148;
  ulong local_140;
  int local_134;
  Mat *local_130;
  Mat *local_128;
  int local_11c;
  ulong local_118;
  int local_10c;
  ulong local_108;
  __m512 local_100;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  local_158 = a;
  local_130 = b;
  local_128 = c;
  switch(op_type) {
  case 0:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        pfVar94 = (float *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            auVar100 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar94));
            auVar100 = vaddps_avx512f(auVar100,*pauVar93);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            pfVar94 = pfVar94 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            fVar130 = *pfVar94;
            auVar144._0_4_ = fVar130 + *(float *)*pauVar93;
            auVar144._4_4_ = fVar130 + *(float *)(*pauVar93 + 4);
            auVar144._8_4_ = fVar130 + *(float *)(*pauVar93 + 8);
            auVar144._12_4_ = fVar130 + *(float *)(*pauVar93 + 0xc);
            auVar144._16_4_ = fVar130 + *(float *)(*pauVar93 + 0x10);
            auVar144._20_4_ = fVar130 + *(float *)(*pauVar93 + 0x14);
            auVar144._24_4_ = fVar130 + *(float *)(*pauVar93 + 0x18);
            auVar144._28_4_ = fVar130 + *(float *)(*pauVar93 + 0x1c);
            *(undefined1 (*) [32])*pauVar95 = auVar144;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            fVar130 = *pfVar94;
            auVar131._0_4_ = fVar130 + *(float *)*pauVar93;
            auVar131._4_4_ = fVar130 + *(float *)(*pauVar93 + 4);
            auVar131._8_4_ = fVar130 + *(float *)(*pauVar93 + 8);
            auVar131._12_4_ = fVar130 + *(float *)(*pauVar93 + 0xc);
            *(undefined1 (*) [16])*pauVar95 = auVar131;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            *(float *)((long)*pauVar95 + lVar90 * 4) =
                 pfVar94[lVar90] + *(float *)(*pauVar93 + lVar90 * 4);
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                pfVar94 = (float *)((long)b->data +
                                   (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90);
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    auVar100 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar94));
                    auVar100 = vaddps_avx512f(auVar100,*pauVar95);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    fVar130 = *pfVar94;
                    auVar145._0_4_ = fVar130 + *(float *)*pauVar95;
                    auVar145._4_4_ = fVar130 + *(float *)(*pauVar95 + 4);
                    auVar145._8_4_ = fVar130 + *(float *)(*pauVar95 + 8);
                    auVar145._12_4_ = fVar130 + *(float *)(*pauVar95 + 0xc);
                    auVar145._16_4_ = fVar130 + *(float *)(*pauVar95 + 0x10);
                    auVar145._20_4_ = fVar130 + *(float *)(*pauVar95 + 0x14);
                    auVar145._24_4_ = fVar130 + *(float *)(*pauVar95 + 0x18);
                    auVar145._28_4_ = fVar130 + *(float *)(*pauVar95 + 0x1c);
                    *(undefined1 (*) [32])*pauVar93 = auVar145;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    fVar130 = *pfVar94;
                    auVar132._0_4_ = fVar130 + *(float *)*pauVar95;
                    auVar132._4_4_ = fVar130 + *(float *)(*pauVar95 + 4);
                    auVar132._8_4_ = fVar130 + *(float *)(*pauVar95 + 8);
                    auVar132._12_4_ = fVar130 + *(float *)(*pauVar95 + 0xc);
                    *(undefined1 (*) [16])*pauVar93 = auVar132;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    *(float *)((long)*pauVar93 + lVar90 * 4) =
                         pfVar94[lVar90] + *(float *)(*pauVar95 + lVar90 * 4);
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 1:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        puVar87 = (undefined4 *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar114._4_4_ = uVar1;
            auVar114._0_4_ = uVar1;
            auVar114._8_4_ = uVar1;
            auVar114._12_4_ = uVar1;
            auVar114._16_4_ = uVar1;
            auVar114._20_4_ = uVar1;
            auVar114._24_4_ = uVar1;
            auVar114._28_4_ = uVar1;
            auVar114._32_4_ = uVar1;
            auVar114._36_4_ = uVar1;
            auVar114._40_4_ = uVar1;
            auVar114._44_4_ = uVar1;
            auVar114._48_4_ = uVar1;
            auVar114._52_4_ = uVar1;
            auVar114._56_4_ = uVar1;
            auVar114._60_4_ = uVar1;
            auVar100 = vsubps_avx512f(*pauVar93,auVar114);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            puVar87 = puVar87 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar66._4_4_ = uVar1;
            auVar66._0_4_ = uVar1;
            auVar66._8_4_ = uVar1;
            auVar66._12_4_ = uVar1;
            auVar66._16_4_ = uVar1;
            auVar66._20_4_ = uVar1;
            auVar66._24_4_ = uVar1;
            auVar66._28_4_ = uVar1;
            auVar99 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar93,auVar66);
            *(undefined1 (*) [32])*pauVar95 = auVar99;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            puVar87 = puVar87 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar60._4_4_ = uVar1;
            auVar60._0_4_ = uVar1;
            auVar60._8_4_ = uVar1;
            auVar60._12_4_ = uVar1;
            auVar98 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar93,auVar60);
            *(undefined1 (*) [16])*pauVar95 = auVar98;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            puVar87 = puVar87 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            *(float *)((long)*pauVar95 + lVar90 * 4) =
                 *(float *)(*pauVar93 + lVar90 * 4) - (float)puVar87[lVar90];
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                puVar87 = (undefined4 *)
                          ((long)b->data + (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90
                          );
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar122._4_4_ = uVar1;
                    auVar122._0_4_ = uVar1;
                    auVar122._8_4_ = uVar1;
                    auVar122._12_4_ = uVar1;
                    auVar122._16_4_ = uVar1;
                    auVar122._20_4_ = uVar1;
                    auVar122._24_4_ = uVar1;
                    auVar122._28_4_ = uVar1;
                    auVar122._32_4_ = uVar1;
                    auVar122._36_4_ = uVar1;
                    auVar122._40_4_ = uVar1;
                    auVar122._44_4_ = uVar1;
                    auVar122._48_4_ = uVar1;
                    auVar122._52_4_ = uVar1;
                    auVar122._56_4_ = uVar1;
                    auVar122._60_4_ = uVar1;
                    auVar100 = vsubps_avx512f(*pauVar95,auVar122);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    puVar87 = puVar87 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar67._4_4_ = uVar1;
                    auVar67._0_4_ = uVar1;
                    auVar67._8_4_ = uVar1;
                    auVar67._12_4_ = uVar1;
                    auVar67._16_4_ = uVar1;
                    auVar67._20_4_ = uVar1;
                    auVar67._24_4_ = uVar1;
                    auVar67._28_4_ = uVar1;
                    auVar99 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar95,auVar67);
                    *(undefined1 (*) [32])*pauVar93 = auVar99;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    puVar87 = puVar87 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar61._4_4_ = uVar1;
                    auVar61._0_4_ = uVar1;
                    auVar61._8_4_ = uVar1;
                    auVar61._12_4_ = uVar1;
                    auVar98 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar95,auVar61);
                    *(undefined1 (*) [16])*pauVar93 = auVar98;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    puVar87 = puVar87 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    *(float *)((long)*pauVar93 + lVar90 * 4) =
                         *(float *)(*pauVar95 + lVar90 * 4) - (float)puVar87[lVar90];
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 2:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        pfVar94 = (float *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            auVar100 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar94));
            auVar100 = vmulps_avx512f(auVar100,*pauVar93);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            pfVar94 = pfVar94 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            fVar130 = *pfVar94;
            auVar73._4_4_ = fVar130 * *(float *)(*pauVar93 + 4);
            auVar73._0_4_ = fVar130 * *(float *)*pauVar93;
            auVar73._8_4_ = fVar130 * *(float *)(*pauVar93 + 8);
            auVar73._12_4_ = fVar130 * *(float *)(*pauVar93 + 0xc);
            auVar73._16_4_ = fVar130 * *(float *)(*pauVar93 + 0x10);
            auVar73._20_4_ = fVar130 * *(float *)(*pauVar93 + 0x14);
            auVar73._24_4_ = fVar130 * *(float *)(*pauVar93 + 0x18);
            auVar73._28_4_ = fVar130;
            *(undefined1 (*) [32])*pauVar95 = auVar73;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            fVar130 = *pfVar94;
            auVar136._0_4_ = fVar130 * *(float *)*pauVar93;
            auVar136._4_4_ = fVar130 * *(float *)(*pauVar93 + 4);
            auVar136._8_4_ = fVar130 * *(float *)(*pauVar93 + 8);
            auVar136._12_4_ = fVar130 * *(float *)(*pauVar93 + 0xc);
            *(undefined1 (*) [16])*pauVar95 = auVar136;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            *(float *)((long)*pauVar95 + lVar90 * 4) =
                 pfVar94[lVar90] * *(float *)(*pauVar93 + lVar90 * 4);
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                pfVar94 = (float *)((long)b->data +
                                   (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90);
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    auVar100 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar94));
                    auVar100 = vmulps_avx512f(auVar100,*pauVar95);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    fVar130 = *pfVar94;
                    auVar74._4_4_ = fVar130 * *(float *)(*pauVar95 + 4);
                    auVar74._0_4_ = fVar130 * *(float *)*pauVar95;
                    auVar74._8_4_ = fVar130 * *(float *)(*pauVar95 + 8);
                    auVar74._12_4_ = fVar130 * *(float *)(*pauVar95 + 0xc);
                    auVar74._16_4_ = fVar130 * *(float *)(*pauVar95 + 0x10);
                    auVar74._20_4_ = fVar130 * *(float *)(*pauVar95 + 0x14);
                    auVar74._24_4_ = fVar130 * *(float *)(*pauVar95 + 0x18);
                    auVar74._28_4_ = fVar130;
                    *(undefined1 (*) [32])*pauVar93 = auVar74;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    fVar130 = *pfVar94;
                    auVar137._0_4_ = fVar130 * *(float *)*pauVar95;
                    auVar137._4_4_ = fVar130 * *(float *)(*pauVar95 + 4);
                    auVar137._8_4_ = fVar130 * *(float *)(*pauVar95 + 8);
                    auVar137._12_4_ = fVar130 * *(float *)(*pauVar95 + 0xc);
                    *(undefined1 (*) [16])*pauVar93 = auVar137;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    *(float *)((long)*pauVar93 + lVar90 * 4) =
                         pfVar94[lVar90] * *(float *)(*pauVar95 + lVar90 * 4);
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 3:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        pfVar94 = (float *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            auVar100 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *pfVar94)));
            auVar100 = vmulps_avx512f(auVar100,*pauVar93);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            pfVar94 = pfVar94 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            fVar130 = 1.0 / *pfVar94;
            auVar75._4_4_ = fVar130 * *(float *)(*pauVar93 + 4);
            auVar75._0_4_ = fVar130 * *(float *)*pauVar93;
            auVar75._8_4_ = fVar130 * *(float *)(*pauVar93 + 8);
            auVar75._12_4_ = fVar130 * *(float *)(*pauVar93 + 0xc);
            auVar75._16_4_ = fVar130 * *(float *)(*pauVar93 + 0x10);
            auVar75._20_4_ = fVar130 * *(float *)(*pauVar93 + 0x14);
            auVar75._24_4_ = fVar130 * *(float *)(*pauVar93 + 0x18);
            auVar75._28_4_ = fVar130;
            *(undefined1 (*) [32])*pauVar95 = auVar75;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            fVar130 = 1.0 / *pfVar94;
            auVar156._0_4_ = fVar130 * *(float *)*pauVar93;
            auVar156._4_4_ = fVar130 * *(float *)(*pauVar93 + 4);
            auVar156._8_4_ = fVar130 * *(float *)(*pauVar93 + 8);
            auVar156._12_4_ = fVar130 * *(float *)(*pauVar93 + 0xc);
            *(undefined1 (*) [16])*pauVar95 = auVar156;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            *(float *)((long)*pauVar95 + lVar90 * 4) =
                 *(float *)(*pauVar93 + lVar90 * 4) / pfVar94[lVar90];
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                pfVar94 = (float *)((long)b->data +
                                   (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90);
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    auVar100 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *pfVar94)));
                    auVar100 = vmulps_avx512f(auVar100,*pauVar95);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    fVar130 = 1.0 / *pfVar94;
                    auVar76._4_4_ = fVar130 * *(float *)(*pauVar95 + 4);
                    auVar76._0_4_ = fVar130 * *(float *)*pauVar95;
                    auVar76._8_4_ = fVar130 * *(float *)(*pauVar95 + 8);
                    auVar76._12_4_ = fVar130 * *(float *)(*pauVar95 + 0xc);
                    auVar76._16_4_ = fVar130 * *(float *)(*pauVar95 + 0x10);
                    auVar76._20_4_ = fVar130 * *(float *)(*pauVar95 + 0x14);
                    auVar76._24_4_ = fVar130 * *(float *)(*pauVar95 + 0x18);
                    auVar76._28_4_ = fVar130;
                    *(undefined1 (*) [32])*pauVar93 = auVar76;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    fVar130 = 1.0 / *pfVar94;
                    auVar157._0_4_ = fVar130 * *(float *)*pauVar95;
                    auVar157._4_4_ = fVar130 * *(float *)(*pauVar95 + 4);
                    auVar157._8_4_ = fVar130 * *(float *)(*pauVar95 + 8);
                    auVar157._12_4_ = fVar130 * *(float *)(*pauVar95 + 0xc);
                    *(undefined1 (*) [16])*pauVar93 = auVar157;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    *(float *)((long)*pauVar93 + lVar90 * 4) =
                         *(float *)(*pauVar95 + lVar90 * 4) / pfVar94[lVar90];
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 4:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        puVar87 = (undefined4 *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar112._4_4_ = uVar1;
            auVar112._0_4_ = uVar1;
            auVar112._8_4_ = uVar1;
            auVar112._12_4_ = uVar1;
            auVar112._16_4_ = uVar1;
            auVar112._20_4_ = uVar1;
            auVar112._24_4_ = uVar1;
            auVar112._28_4_ = uVar1;
            auVar112._32_4_ = uVar1;
            auVar112._36_4_ = uVar1;
            auVar112._40_4_ = uVar1;
            auVar112._44_4_ = uVar1;
            auVar112._48_4_ = uVar1;
            auVar112._52_4_ = uVar1;
            auVar112._56_4_ = uVar1;
            auVar112._60_4_ = uVar1;
            auVar100 = vmaxps_avx512f(*pauVar93,auVar112);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            puVar87 = puVar87 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar64._4_4_ = uVar1;
            auVar64._0_4_ = uVar1;
            auVar64._8_4_ = uVar1;
            auVar64._12_4_ = uVar1;
            auVar64._16_4_ = uVar1;
            auVar64._20_4_ = uVar1;
            auVar64._24_4_ = uVar1;
            auVar64._28_4_ = uVar1;
            auVar99 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar93,auVar64);
            *(undefined1 (*) [32])*pauVar95 = auVar99;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            puVar87 = puVar87 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar58._4_4_ = uVar1;
            auVar58._0_4_ = uVar1;
            auVar58._8_4_ = uVar1;
            auVar58._12_4_ = uVar1;
            auVar98 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar93,auVar58);
            *(undefined1 (*) [16])*pauVar95 = auVar98;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            puVar87 = puVar87 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            auVar98 = vmaxss_avx(ZEXT416((uint)puVar87[lVar90]),
                                 ZEXT416(*(uint *)(*pauVar93 + lVar90 * 4)));
            *(int *)((long)*pauVar95 + lVar90 * 4) = auVar98._0_4_;
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                puVar87 = (undefined4 *)
                          ((long)b->data + (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90
                          );
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar113._4_4_ = uVar1;
                    auVar113._0_4_ = uVar1;
                    auVar113._8_4_ = uVar1;
                    auVar113._12_4_ = uVar1;
                    auVar113._16_4_ = uVar1;
                    auVar113._20_4_ = uVar1;
                    auVar113._24_4_ = uVar1;
                    auVar113._28_4_ = uVar1;
                    auVar113._32_4_ = uVar1;
                    auVar113._36_4_ = uVar1;
                    auVar113._40_4_ = uVar1;
                    auVar113._44_4_ = uVar1;
                    auVar113._48_4_ = uVar1;
                    auVar113._52_4_ = uVar1;
                    auVar113._56_4_ = uVar1;
                    auVar113._60_4_ = uVar1;
                    auVar100 = vmaxps_avx512f(*pauVar95,auVar113);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    puVar87 = puVar87 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar65._4_4_ = uVar1;
                    auVar65._0_4_ = uVar1;
                    auVar65._8_4_ = uVar1;
                    auVar65._12_4_ = uVar1;
                    auVar65._16_4_ = uVar1;
                    auVar65._20_4_ = uVar1;
                    auVar65._24_4_ = uVar1;
                    auVar65._28_4_ = uVar1;
                    auVar99 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar95,auVar65);
                    *(undefined1 (*) [32])*pauVar93 = auVar99;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    puVar87 = puVar87 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar59._4_4_ = uVar1;
                    auVar59._0_4_ = uVar1;
                    auVar59._8_4_ = uVar1;
                    auVar59._12_4_ = uVar1;
                    auVar98 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar95,auVar59);
                    *(undefined1 (*) [16])*pauVar93 = auVar98;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    puVar87 = puVar87 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    auVar98 = vmaxss_avx(ZEXT416((uint)puVar87[lVar90]),
                                         ZEXT416(*(uint *)(*pauVar95 + lVar90 * 4)));
                    *(int *)((long)*pauVar93 + lVar90 * 4) = auVar98._0_4_;
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 5:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        puVar87 = (undefined4 *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar110._4_4_ = uVar1;
            auVar110._0_4_ = uVar1;
            auVar110._8_4_ = uVar1;
            auVar110._12_4_ = uVar1;
            auVar110._16_4_ = uVar1;
            auVar110._20_4_ = uVar1;
            auVar110._24_4_ = uVar1;
            auVar110._28_4_ = uVar1;
            auVar110._32_4_ = uVar1;
            auVar110._36_4_ = uVar1;
            auVar110._40_4_ = uVar1;
            auVar110._44_4_ = uVar1;
            auVar110._48_4_ = uVar1;
            auVar110._52_4_ = uVar1;
            auVar110._56_4_ = uVar1;
            auVar110._60_4_ = uVar1;
            auVar100 = vminps_avx512f(*pauVar93,auVar110);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            puVar87 = puVar87 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar62._4_4_ = uVar1;
            auVar62._0_4_ = uVar1;
            auVar62._8_4_ = uVar1;
            auVar62._12_4_ = uVar1;
            auVar62._16_4_ = uVar1;
            auVar62._20_4_ = uVar1;
            auVar62._24_4_ = uVar1;
            auVar62._28_4_ = uVar1;
            auVar99 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar93,auVar62);
            *(undefined1 (*) [32])*pauVar95 = auVar99;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            puVar87 = puVar87 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            uVar1 = *puVar87;
            auVar56._4_4_ = uVar1;
            auVar56._0_4_ = uVar1;
            auVar56._8_4_ = uVar1;
            auVar56._12_4_ = uVar1;
            auVar98 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar93,auVar56);
            *(undefined1 (*) [16])*pauVar95 = auVar98;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            puVar87 = puVar87 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            auVar98 = vminss_avx(ZEXT416((uint)puVar87[lVar90]),
                                 ZEXT416(*(uint *)(*pauVar93 + lVar90 * 4)));
            *(int *)((long)*pauVar95 + lVar90 * 4) = auVar98._0_4_;
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                puVar87 = (undefined4 *)
                          ((long)b->data + (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90
                          );
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar111._4_4_ = uVar1;
                    auVar111._0_4_ = uVar1;
                    auVar111._8_4_ = uVar1;
                    auVar111._12_4_ = uVar1;
                    auVar111._16_4_ = uVar1;
                    auVar111._20_4_ = uVar1;
                    auVar111._24_4_ = uVar1;
                    auVar111._28_4_ = uVar1;
                    auVar111._32_4_ = uVar1;
                    auVar111._36_4_ = uVar1;
                    auVar111._40_4_ = uVar1;
                    auVar111._44_4_ = uVar1;
                    auVar111._48_4_ = uVar1;
                    auVar111._52_4_ = uVar1;
                    auVar111._56_4_ = uVar1;
                    auVar111._60_4_ = uVar1;
                    auVar100 = vminps_avx512f(*pauVar95,auVar111);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    puVar87 = puVar87 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar63._4_4_ = uVar1;
                    auVar63._0_4_ = uVar1;
                    auVar63._8_4_ = uVar1;
                    auVar63._12_4_ = uVar1;
                    auVar63._16_4_ = uVar1;
                    auVar63._20_4_ = uVar1;
                    auVar63._24_4_ = uVar1;
                    auVar63._28_4_ = uVar1;
                    auVar99 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar95,auVar63);
                    *(undefined1 (*) [32])*pauVar93 = auVar99;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    puVar87 = puVar87 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    uVar1 = *puVar87;
                    auVar57._4_4_ = uVar1;
                    auVar57._0_4_ = uVar1;
                    auVar57._8_4_ = uVar1;
                    auVar57._12_4_ = uVar1;
                    auVar98 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar95,auVar57);
                    *(undefined1 (*) [16])*pauVar93 = auVar98;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    puVar87 = puVar87 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    auVar98 = vminss_avx(ZEXT416((uint)puVar87[lVar90]),
                                         ZEXT416(*(uint *)(*pauVar95 + lVar90 * 4)));
                    *(int *)((long)*pauVar93 + lVar90 * 4) = auVar98._0_4_;
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 6:
    local_160 = (ulong)(uint)a->w;
    local_150 = (ulong)(uint)a->h;
    local_11c = a->d;
    local_108 = (ulong)(uint)a->c;
    local_134 = a->elempack;
    if (0 < a->h && a->dims == 2) {
      bVar3 = a->w < 1;
      local_148 = CONCAT71(local_148._1_7_,local_134 != 0x10 || bVar3);
      local_161 = local_134 != 8 || bVar3;
      local_162 = local_134 != 4 || bVar3;
      local_163 = local_134 != 1 || bVar3;
      uVar82 = 0;
      do {
        pfVar94 = (float *)((long)local_158->w * uVar82 * local_158->elemsize +
                           (long)local_158->data);
        puVar86 = (uint *)local_130->data;
        pfVar96 = (float *)((long)local_128->w * uVar82 * local_128->elemsize +
                           (long)local_128->data);
        local_140 = uVar82;
        if ((char)local_148 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])pfVar94;
            afStack_b8 = *(float (*) [2])(pfVar94 + 2);
            afStack_b0 = *(float (*) [2])(pfVar94 + 4);
            afStack_a8 = *(float (*) [2])(pfVar94 + 6);
            afStack_a0 = *(float (*) [2])(pfVar94 + 8);
            afStack_98 = *(float (*) [2])(pfVar94 + 10);
            afStack_90 = *(float (*) [2])(pfVar94 + 0xc);
            afStack_88._0_8_ = *(undefined8 *)(pfVar94 + 0xe);
            afVar125 = (__m512)vbroadcastss_avx512f(ZEXT416(*puVar86));
            local_100 = afVar125;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      ((binary_op_pow *)&local_164,(__m512 *)local_c0,&local_100);
            *(__m512 *)pfVar96 = afVar125;
            pfVar94 = pfVar94 + 0x10;
            puVar86 = puVar86 + 1;
            pfVar96 = (float *)((long)pfVar96 + 0x40);
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        if (local_161 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])pfVar94;
            afStack_b8 = *(float (*) [2])(pfVar94 + 2);
            afStack_b0 = *(float (*) [2])(pfVar94 + 4);
            afStack_a8 = *(float (*) [2])(pfVar94 + 6);
            uVar77 = *puVar86;
            auVar151._4_4_ = uVar77;
            auVar151._0_4_ = uVar77;
            auVar151._8_4_ = uVar77;
            auVar151._12_4_ = uVar77;
            auVar151._16_4_ = uVar77;
            auVar151._20_4_ = uVar77;
            auVar151._24_4_ = uVar77;
            auVar151._28_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            local_100[4] = (float)uVar77;
            local_100[5] = (float)uVar77;
            local_100[6] = (float)uVar77;
            local_100[7] = (float)uVar77;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                      ((binary_op_pow *)&local_164,(__m256 *)local_c0,(__m256 *)local_100);
            *(undefined1 (*) [32])*(__m512 *)pfVar96 = auVar151;
            pfVar94 = pfVar94 + 8;
            puVar86 = puVar86 + 1;
            pfVar96 = *(__m512 *)pfVar96 + 8;
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        if (local_162 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])pfVar94;
            afStack_b8 = *(float (*) [2])(pfVar94 + 2);
            uVar77 = *puVar86;
            auVar140._4_4_ = uVar77;
            auVar140._0_4_ = uVar77;
            auVar140._8_4_ = uVar77;
            auVar140._12_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            auVar155 = ZEXT856(auVar140._8_8_);
            afVar165 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                 ((binary_op_pow *)&local_164,(__m128 *)local_c0,(__m128 *)local_100
                                 );
            auVar108._0_8_ = afVar165._0_8_;
            auVar108._8_56_ = auVar155;
            *(undefined1 (*) [16])*(__m512 *)pfVar96 = auVar108._0_16_;
            pfVar94 = pfVar94 + 4;
            puVar86 = puVar86 + 1;
            pfVar96 = *(__m512 *)pfVar96 + 4;
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        uVar82 = local_160;
        if (local_163 == '\0') {
          lVar90 = 0;
          do {
            fVar130 = powf(pfVar94[lVar90],(float)puVar86[lVar90]);
            (*(__m512 *)pfVar96)[lVar90] = fVar130;
            lVar90 = lVar90 + 1;
          } while ((int)uVar82 != (int)lVar90);
        }
        uVar82 = local_140 + 1;
      } while (uVar82 != local_150);
    }
    uVar77 = local_158->dims - 3;
    uVar72 = (undefined3)(uVar77 >> 8);
    in_EAX = CONCAT31(uVar72,uVar77 < 2);
    if (0 < (int)local_108 && uVar77 < 2) {
      bVar3 = (int)local_160 < 1;
      pMVar79 = (Mat *)(ulong)CONCAT31(uVar72,bVar3);
      local_161 = local_134 != 0x10 || bVar3;
      local_162 = local_134 != 8 || bVar3;
      local_163 = local_134 != 4 || bVar3;
      local_134 = CONCAT31(local_134._1_3_,local_134 != 1 || bVar3);
      local_118 = 0;
      uVar82 = local_160;
      do {
        if (0 < local_11c) {
          pfVar94 = (float *)(local_128->cstep * local_118 * local_128->elemsize +
                             (long)local_128->data);
          pfVar96 = (float *)(local_158->cstep * local_118 * local_158->elemsize +
                             (long)local_158->data);
          local_10c = 0;
          pMVar79 = local_158;
          do {
            if (0 < (int)local_150) {
              iVar78 = local_130->d + -1;
              if (local_10c <= iVar78) {
                iVar78 = local_10c;
              }
              local_148 = (long)iVar78;
              iVar78 = 0;
              do {
                iVar81 = local_130->h + -1;
                local_140 = CONCAT44(local_140._4_4_,iVar78);
                if (iVar78 <= iVar81) {
                  iVar81 = iVar78;
                }
                lVar90 = (long)local_130->w * local_130->elemsize;
                pMVar79 = (Mat *)(local_130->h * local_148 * lVar90 + (long)local_130->data);
                ppvVar84 = (void **)((long)&pMVar79->data + iVar81 * lVar90);
                if (local_161 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])pfVar96;
                    afStack_b8 = *(float (*) [2])(pfVar96 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar96 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar96 + 6);
                    afStack_a0 = *(float (*) [2])(pfVar96 + 8);
                    afStack_98 = *(float (*) [2])(pfVar96 + 10);
                    afStack_90 = *(float (*) [2])(pfVar96 + 0xc);
                    afStack_88._0_8_ = *(undefined8 *)(pfVar96 + 0xe);
                    afVar125 = (__m512)vbroadcastss_avx512f(ZEXT416((uint)*(float *)ppvVar84));
                    local_100 = afVar125;
                    pMVar79 = (Mat *)BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                               ((binary_op_pow *)&local_164,(__m512 *)local_c0,
                                                &local_100);
                    *(__m512 *)pfVar94 = afVar125;
                    pfVar96 = pfVar96 + 0x10;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pfVar94 = (float *)((long)pfVar94 + 0x40);
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                  } while (uVar77 != 0);
                }
                if (local_162 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])pfVar96;
                    afStack_b8 = *(float (*) [2])(pfVar96 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar96 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar96 + 6);
                    fVar130 = *(float *)ppvVar84;
                    auVar152._4_4_ = fVar130;
                    auVar152._0_4_ = fVar130;
                    auVar152._8_4_ = fVar130;
                    auVar152._12_4_ = fVar130;
                    auVar152._16_4_ = fVar130;
                    auVar152._20_4_ = fVar130;
                    auVar152._24_4_ = fVar130;
                    auVar152._28_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    local_100[4] = fVar130;
                    local_100[5] = fVar130;
                    local_100[6] = fVar130;
                    local_100[7] = fVar130;
                    pMVar79 = (Mat *)BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                               ((binary_op_pow *)&local_164,(__m256 *)local_c0,
                                                (__m256 *)local_100);
                    *(undefined1 (*) [32])*(__m512 *)pfVar94 = auVar152;
                    pfVar96 = pfVar96 + 8;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pfVar94 = *(__m512 *)pfVar94 + 8;
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                  } while (uVar77 != 0);
                }
                if (local_163 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])pfVar96;
                    afStack_b8 = *(float (*) [2])(pfVar96 + 2);
                    fVar130 = *(float *)ppvVar84;
                    auVar141._4_4_ = fVar130;
                    auVar141._0_4_ = fVar130;
                    auVar141._8_4_ = fVar130;
                    auVar141._12_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    auVar155 = ZEXT856(auVar141._8_8_);
                    afVar165 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                         ((binary_op_pow *)&local_164,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar109._0_8_ = afVar165._0_8_;
                    auVar109._8_56_ = auVar155;
                    *(undefined1 (*) [16])*(__m512 *)pfVar94 = auVar109._0_16_;
                    pfVar96 = pfVar96 + 4;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pfVar94 = *(__m512 *)pfVar94 + 4;
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                    pMVar79 = extraout_RAX_03;
                  } while (uVar77 != 0);
                }
                if ((char)local_134 == '\0') {
                  lVar90 = 0;
                  lVar92 = 0;
                  do {
                    fVar130 = powf(pfVar96[lVar92],*(float *)((long)ppvVar84 + lVar92 * 4));
                    (*(__m512 *)pfVar94)[lVar92] = fVar130;
                    lVar92 = lVar92 + 1;
                    lVar90 = lVar90 + -4;
                  } while ((int)local_160 != (int)lVar92);
                  pfVar94 = (float *)((long)pfVar94 - lVar90);
                  pfVar96 = (float *)((long)pfVar96 - lVar90);
                  pMVar79 = extraout_RAX_04;
                  uVar82 = local_160;
                }
                iVar78 = (int)local_140 + 1;
              } while (iVar78 != (int)local_150);
            }
            local_10c = local_10c + 1;
          } while (local_10c != local_11c);
        }
        in_EAX = (int)pMVar79;
        local_118 = local_118 + 1;
      } while (local_118 != local_108);
    }
    break;
  case 7:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        puVar86 = (uint *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            auVar100 = vbroadcastss_avx512f(ZEXT416(*puVar86));
            auVar100 = vsubps_avx512f(auVar100,*pauVar93);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            puVar86 = puVar86 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            uVar91 = *puVar86;
            auVar149._4_4_ = uVar91;
            auVar149._0_4_ = uVar91;
            auVar149._8_4_ = uVar91;
            auVar149._12_4_ = uVar91;
            auVar149._16_4_ = uVar91;
            auVar149._20_4_ = uVar91;
            auVar149._24_4_ = uVar91;
            auVar149._28_4_ = uVar91;
            auVar99 = vsubps_avx(auVar149,*(undefined1 (*) [32])*pauVar93);
            *(undefined1 (*) [32])*pauVar95 = auVar99;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            puVar86 = puVar86 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            uVar91 = *puVar86;
            auVar138._4_4_ = uVar91;
            auVar138._0_4_ = uVar91;
            auVar138._8_4_ = uVar91;
            auVar138._12_4_ = uVar91;
            auVar98 = vsubps_avx(auVar138,*(undefined1 (*) [16])*pauVar93);
            *(undefined1 (*) [16])*pauVar95 = auVar98;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            puVar86 = puVar86 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            *(float *)((long)*pauVar95 + lVar90 * 4) =
                 (float)puVar86[lVar90] - *(float *)(*pauVar93 + lVar90 * 4);
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                puVar86 = (uint *)((long)b->data +
                                  (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90);
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    auVar100 = vbroadcastss_avx512f(ZEXT416(*puVar86));
                    auVar100 = vsubps_avx512f(auVar100,*pauVar95);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    puVar86 = puVar86 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    uVar85 = *puVar86;
                    auVar150._4_4_ = uVar85;
                    auVar150._0_4_ = uVar85;
                    auVar150._8_4_ = uVar85;
                    auVar150._12_4_ = uVar85;
                    auVar150._16_4_ = uVar85;
                    auVar150._20_4_ = uVar85;
                    auVar150._24_4_ = uVar85;
                    auVar150._28_4_ = uVar85;
                    auVar99 = vsubps_avx(auVar150,*(undefined1 (*) [32])*pauVar95);
                    *(undefined1 (*) [32])*pauVar93 = auVar99;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    puVar86 = puVar86 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    uVar85 = *puVar86;
                    auVar139._4_4_ = uVar85;
                    auVar139._0_4_ = uVar85;
                    auVar139._8_4_ = uVar85;
                    auVar139._12_4_ = uVar85;
                    auVar98 = vsubps_avx(auVar139,*(undefined1 (*) [16])*pauVar95);
                    *(undefined1 (*) [16])*pauVar93 = auVar98;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    puVar86 = puVar86 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    *(float *)((long)*pauVar93 + lVar90 * 4) =
                         (float)puVar86[lVar90] - *(float *)(*pauVar95 + lVar90 * 4);
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 8:
    in_EAX = a->w;
    uVar77 = a->h;
    iVar78 = a->d;
    uVar2 = a->c;
    iVar81 = a->elempack;
    if (0 < (int)uVar77 && a->dims == 2) {
      bVar3 = 0 < in_EAX;
      uVar82 = 0;
      do {
        pauVar93 = (undefined1 (*) [64])((long)a->w * uVar82 * a->elemsize + (long)a->data);
        pfVar94 = (float *)b->data;
        pauVar95 = (undefined1 (*) [64])((long)c->w * uVar82 * c->elemsize + (long)c->data);
        iVar89 = in_EAX;
        if (iVar81 == 0x10 && bVar3) {
          do {
            auVar100 = vrcp14ps_avx512f(*pauVar93);
            auVar101 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar94));
            in_ZMM3 = vmulps_avx512f(auVar101,auVar100);
            auVar101 = vfmsub213ps_avx512f(*pauVar93,in_ZMM3,auVar101);
            auVar100 = vfnmadd213ps_avx512f(auVar101,auVar100,in_ZMM3);
            *pauVar95 = auVar100;
            pauVar93 = pauVar93 + 1;
            pfVar94 = pfVar94 + 1;
            pauVar95 = pauVar95 + 1;
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 8 && bVar3) {
          do {
            auVar99 = vrcpps_avx(*(undefined1 (*) [32])*pauVar93);
            fVar130 = *pfVar94;
            auVar160._4_4_ = fVar130;
            auVar160._0_4_ = fVar130;
            auVar160._8_4_ = fVar130;
            auVar160._12_4_ = fVar130;
            auVar160._16_4_ = fVar130;
            auVar160._20_4_ = fVar130;
            auVar160._24_4_ = fVar130;
            auVar160._28_4_ = fVar130;
            auVar106._0_4_ = fVar130 * auVar99._0_4_;
            auVar106._4_4_ = fVar130 * auVar99._4_4_;
            auVar106._8_4_ = fVar130 * auVar99._8_4_;
            auVar106._12_4_ = fVar130 * auVar99._12_4_;
            auVar106._16_4_ = fVar130 * auVar99._16_4_;
            auVar106._20_4_ = fVar130 * auVar99._20_4_;
            auVar106._28_36_ = in_ZMM3._28_36_;
            auVar106._24_4_ = fVar130 * auVar99._24_4_;
            auVar146 = auVar106._0_32_;
            in_ZMM3 = ZEXT3264(auVar146);
            auVar98 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar93,auVar146,auVar160);
            auVar98 = vfnmadd213ps_fma(ZEXT1632(auVar98),auVar99,auVar146);
            *(undefined1 (*) [32])*pauVar95 = ZEXT1632(auVar98);
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        iVar89 = in_EAX;
        if (iVar81 == 4 && bVar3) {
          do {
            auVar98 = vrcpps_avx(*(undefined1 (*) [16])*pauVar93);
            fVar130 = *pfVar94;
            auVar158._4_4_ = fVar130;
            auVar158._0_4_ = fVar130;
            auVar158._8_4_ = fVar130;
            auVar158._12_4_ = fVar130;
            auVar162._0_4_ = fVar130 * auVar98._0_4_;
            auVar162._4_4_ = fVar130 * auVar98._4_4_;
            auVar162._8_4_ = fVar130 * auVar98._8_4_;
            auVar162._12_4_ = fVar130 * auVar98._12_4_;
            in_ZMM3 = ZEXT1664(auVar162);
            auVar133 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar93,auVar162,auVar158);
            auVar98 = vfnmadd213ps_fma(auVar133,auVar98,auVar162);
            *(undefined1 (*) [16])*pauVar95 = auVar98;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            pfVar94 = pfVar94 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            iVar89 = iVar89 + -1;
          } while (iVar89 != 0);
        }
        if (iVar81 == 1 && bVar3) {
          lVar90 = 0;
          do {
            *(float *)((long)*pauVar95 + lVar90 * 4) =
                 pfVar94[lVar90] / *(float *)(*pauVar93 + lVar90 * 4);
            lVar90 = lVar90 + 1;
          } while (in_EAX != (int)lVar90);
        }
        uVar82 = uVar82 + 1;
      } while (uVar82 != uVar77);
    }
    if (0 < (int)uVar2 && a->dims - 3U < 2) {
      bVar3 = 0 < in_EAX;
      local_150 = 0;
      do {
        if (0 < iVar78) {
          pauVar93 = (undefined1 (*) [64])(c->cstep * local_150 * c->elemsize + (long)c->data);
          pauVar95 = (undefined1 (*) [64])(a->cstep * local_150 * a->elemsize + (long)a->data);
          iVar89 = 0;
          do {
            if (0 < (int)uVar77) {
              iVar83 = b->d + -1;
              if (iVar89 <= iVar83) {
                iVar83 = iVar89;
              }
              uVar91 = 0;
              do {
                uVar85 = b->h - 1;
                if ((int)uVar91 <= (int)uVar85) {
                  uVar85 = uVar91;
                }
                lVar90 = (long)b->w * b->elemsize;
                pfVar94 = (float *)((long)b->data +
                                   (int)uVar85 * lVar90 + (long)b->h * (long)iVar83 * lVar90);
                iVar88 = in_EAX;
                if (iVar81 == 0x10 && bVar3) {
                  do {
                    auVar100 = vrcp14ps_avx512f(*pauVar95);
                    auVar101 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar94));
                    in_ZMM3 = vmulps_avx512f(auVar101,auVar100);
                    auVar101 = vfmsub213ps_avx512f(*pauVar95,in_ZMM3,auVar101);
                    auVar100 = vfnmadd213ps_avx512f(auVar101,auVar100,in_ZMM3);
                    *pauVar93 = auVar100;
                    pauVar95 = pauVar95 + 1;
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = pauVar93 + 1;
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 8 && bVar3) {
                  do {
                    auVar99 = vrcpps_avx(*(undefined1 (*) [32])*pauVar95);
                    fVar130 = *pfVar94;
                    auVar161._4_4_ = fVar130;
                    auVar161._0_4_ = fVar130;
                    auVar161._8_4_ = fVar130;
                    auVar161._12_4_ = fVar130;
                    auVar161._16_4_ = fVar130;
                    auVar161._20_4_ = fVar130;
                    auVar161._24_4_ = fVar130;
                    auVar161._28_4_ = fVar130;
                    auVar107._0_4_ = fVar130 * auVar99._0_4_;
                    auVar107._4_4_ = fVar130 * auVar99._4_4_;
                    auVar107._8_4_ = fVar130 * auVar99._8_4_;
                    auVar107._12_4_ = fVar130 * auVar99._12_4_;
                    auVar107._16_4_ = fVar130 * auVar99._16_4_;
                    auVar107._20_4_ = fVar130 * auVar99._20_4_;
                    auVar107._28_36_ = in_ZMM3._28_36_;
                    auVar107._24_4_ = fVar130 * auVar99._24_4_;
                    auVar146 = auVar107._0_32_;
                    in_ZMM3 = ZEXT3264(auVar146);
                    auVar98 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar95,auVar146,auVar161);
                    auVar98 = vfnmadd213ps_fma(ZEXT1632(auVar98),auVar99,auVar146);
                    *(undefined1 (*) [32])*pauVar93 = ZEXT1632(auVar98);
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                iVar88 = in_EAX;
                if (iVar81 == 4 && bVar3) {
                  do {
                    auVar98 = vrcpps_avx(*(undefined1 (*) [16])*pauVar95);
                    fVar130 = *pfVar94;
                    auVar159._4_4_ = fVar130;
                    auVar159._0_4_ = fVar130;
                    auVar159._8_4_ = fVar130;
                    auVar159._12_4_ = fVar130;
                    auVar163._0_4_ = fVar130 * auVar98._0_4_;
                    auVar163._4_4_ = fVar130 * auVar98._4_4_;
                    auVar163._8_4_ = fVar130 * auVar98._8_4_;
                    auVar163._12_4_ = fVar130 * auVar98._12_4_;
                    in_ZMM3 = ZEXT1664(auVar163);
                    auVar133 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar95,auVar163,auVar159);
                    auVar98 = vfnmadd213ps_fma(auVar133,auVar98,auVar163);
                    *(undefined1 (*) [16])*pauVar93 = auVar98;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    pfVar94 = pfVar94 + 1;
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    iVar88 = iVar88 + -1;
                  } while (iVar88 != 0);
                }
                if (iVar81 == 1 && bVar3) {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    *(float *)((long)*pauVar93 + lVar90 * 4) =
                         pfVar94[lVar90] / *(float *)(*pauVar95 + lVar90 * 4);
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while (in_EAX != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                }
                uVar91 = uVar91 + 1;
              } while (uVar91 != uVar77);
            }
            iVar89 = iVar89 + 1;
          } while (iVar89 != iVar78);
        }
        local_150 = local_150 + 1;
      } while (local_150 != uVar2);
    }
    break;
  case 9:
    local_160 = (ulong)(uint)a->w;
    local_150 = (ulong)(uint)a->h;
    local_11c = a->d;
    local_108 = (ulong)(uint)a->c;
    local_134 = a->elempack;
    if (0 < a->h && a->dims == 2) {
      bVar3 = a->w < 1;
      local_148 = CONCAT71(local_148._1_7_,local_134 != 0x10 || bVar3);
      local_161 = local_134 != 8 || bVar3;
      local_162 = local_134 != 4 || bVar3;
      local_163 = local_134 != 1 || bVar3;
      uVar82 = 0;
      do {
        pfVar94 = (float *)((long)local_158->w * uVar82 * local_158->elemsize +
                           (long)local_158->data);
        puVar86 = (uint *)local_130->data;
        pfVar96 = (float *)((long)local_128->w * uVar82 * local_128->elemsize +
                           (long)local_128->data);
        local_140 = uVar82;
        if ((char)local_148 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])pfVar94;
            afStack_b8 = *(float (*) [2])(pfVar94 + 2);
            afStack_b0 = *(float (*) [2])(pfVar94 + 4);
            afStack_a8 = *(float (*) [2])(pfVar94 + 6);
            afStack_a0 = *(float (*) [2])(pfVar94 + 8);
            afStack_98 = *(float (*) [2])(pfVar94 + 10);
            afStack_90 = *(float (*) [2])(pfVar94 + 0xc);
            afStack_88._0_8_ = *(undefined8 *)(pfVar94 + 0xe);
            afVar125 = (__m512)vbroadcastss_avx512f(ZEXT416(*puVar86));
            local_100 = afVar125;
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                      ((binary_op_rpow *)&local_164,(__m512 *)local_c0,&local_100);
            *(__m512 *)pfVar96 = afVar125;
            pfVar94 = pfVar94 + 0x10;
            puVar86 = puVar86 + 1;
            pfVar96 = (float *)((long)pfVar96 + 0x40);
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        if (local_161 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])pfVar94;
            afStack_b8 = *(float (*) [2])(pfVar94 + 2);
            afStack_b0 = *(float (*) [2])(pfVar94 + 4);
            afStack_a8 = *(float (*) [2])(pfVar94 + 6);
            uVar77 = *puVar86;
            auVar147._4_4_ = uVar77;
            auVar147._0_4_ = uVar77;
            auVar147._8_4_ = uVar77;
            auVar147._12_4_ = uVar77;
            auVar147._16_4_ = uVar77;
            auVar147._20_4_ = uVar77;
            auVar147._24_4_ = uVar77;
            auVar147._28_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            local_100[4] = (float)uVar77;
            local_100[5] = (float)uVar77;
            local_100[6] = (float)uVar77;
            local_100[7] = (float)uVar77;
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                      ((binary_op_rpow *)&local_164,(__m256 *)local_c0,(__m256 *)local_100);
            *(undefined1 (*) [32])*(__m512 *)pfVar96 = auVar147;
            pfVar94 = pfVar94 + 8;
            puVar86 = puVar86 + 1;
            pfVar96 = *(__m512 *)pfVar96 + 8;
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        if (local_162 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])pfVar94;
            afStack_b8 = *(float (*) [2])(pfVar94 + 2);
            uVar77 = *puVar86;
            auVar134._4_4_ = uVar77;
            auVar134._0_4_ = uVar77;
            auVar134._8_4_ = uVar77;
            auVar134._12_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            auVar155 = ZEXT856(auVar134._8_8_);
            afVar165 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                 ((binary_op_rpow *)&local_164,(__m128 *)local_c0,
                                  (__m128 *)local_100);
            auVar104._0_8_ = afVar165._0_8_;
            auVar104._8_56_ = auVar155;
            *(undefined1 (*) [16])*(__m512 *)pfVar96 = auVar104._0_16_;
            pfVar94 = pfVar94 + 4;
            puVar86 = puVar86 + 1;
            pfVar96 = *(__m512 *)pfVar96 + 4;
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        uVar82 = local_160;
        if (local_163 == '\0') {
          lVar90 = 0;
          do {
            fVar130 = powf((float)puVar86[lVar90],pfVar94[lVar90]);
            (*(__m512 *)pfVar96)[lVar90] = fVar130;
            lVar90 = lVar90 + 1;
          } while ((int)uVar82 != (int)lVar90);
        }
        uVar82 = local_140 + 1;
      } while (uVar82 != local_150);
    }
    uVar77 = local_158->dims - 3;
    uVar72 = (undefined3)(uVar77 >> 8);
    in_EAX = CONCAT31(uVar72,uVar77 < 2);
    if (0 < (int)local_108 && uVar77 < 2) {
      bVar3 = (int)local_160 < 1;
      pMVar79 = (Mat *)(ulong)CONCAT31(uVar72,bVar3);
      local_161 = local_134 != 0x10 || bVar3;
      local_162 = local_134 != 8 || bVar3;
      local_163 = local_134 != 4 || bVar3;
      local_134 = CONCAT31(local_134._1_3_,local_134 != 1 || bVar3);
      local_118 = 0;
      uVar82 = local_160;
      do {
        if (0 < local_11c) {
          pfVar94 = (float *)(local_128->cstep * local_118 * local_128->elemsize +
                             (long)local_128->data);
          pfVar96 = (float *)(local_158->cstep * local_118 * local_158->elemsize +
                             (long)local_158->data);
          local_10c = 0;
          pMVar79 = local_158;
          do {
            if (0 < (int)local_150) {
              iVar78 = local_130->d + -1;
              if (local_10c <= iVar78) {
                iVar78 = local_10c;
              }
              local_148 = (long)iVar78;
              iVar78 = 0;
              do {
                iVar81 = local_130->h + -1;
                local_140 = CONCAT44(local_140._4_4_,iVar78);
                if (iVar78 <= iVar81) {
                  iVar81 = iVar78;
                }
                lVar90 = (long)local_130->w * local_130->elemsize;
                pMVar79 = (Mat *)(local_130->h * local_148 * lVar90 + (long)local_130->data);
                ppvVar84 = (void **)((long)&pMVar79->data + iVar81 * lVar90);
                if (local_161 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])pfVar96;
                    afStack_b8 = *(float (*) [2])(pfVar96 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar96 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar96 + 6);
                    afStack_a0 = *(float (*) [2])(pfVar96 + 8);
                    afStack_98 = *(float (*) [2])(pfVar96 + 10);
                    afStack_90 = *(float (*) [2])(pfVar96 + 0xc);
                    afStack_88._0_8_ = *(undefined8 *)(pfVar96 + 0xe);
                    afVar125 = (__m512)vbroadcastss_avx512f(ZEXT416((uint)*(float *)ppvVar84));
                    local_100 = afVar125;
                    pMVar79 = (Mat *)BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                                               ((binary_op_rpow *)&local_164,(__m512 *)local_c0,
                                                &local_100);
                    *(__m512 *)pfVar94 = afVar125;
                    pfVar96 = pfVar96 + 0x10;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pfVar94 = (float *)((long)pfVar94 + 0x40);
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                  } while (uVar77 != 0);
                }
                if (local_162 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])pfVar96;
                    afStack_b8 = *(float (*) [2])(pfVar96 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar96 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar96 + 6);
                    fVar130 = *(float *)ppvVar84;
                    auVar148._4_4_ = fVar130;
                    auVar148._0_4_ = fVar130;
                    auVar148._8_4_ = fVar130;
                    auVar148._12_4_ = fVar130;
                    auVar148._16_4_ = fVar130;
                    auVar148._20_4_ = fVar130;
                    auVar148._24_4_ = fVar130;
                    auVar148._28_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    local_100[4] = fVar130;
                    local_100[5] = fVar130;
                    local_100[6] = fVar130;
                    local_100[7] = fVar130;
                    pMVar79 = (Mat *)BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                                               ((binary_op_rpow *)&local_164,(__m256 *)local_c0,
                                                (__m256 *)local_100);
                    *(undefined1 (*) [32])*(__m512 *)pfVar94 = auVar148;
                    pfVar96 = pfVar96 + 8;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pfVar94 = *(__m512 *)pfVar94 + 8;
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                  } while (uVar77 != 0);
                }
                if (local_163 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])pfVar96;
                    afStack_b8 = *(float (*) [2])(pfVar96 + 2);
                    fVar130 = *(float *)ppvVar84;
                    auVar135._4_4_ = fVar130;
                    auVar135._0_4_ = fVar130;
                    auVar135._8_4_ = fVar130;
                    auVar135._12_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    auVar155 = ZEXT856(auVar135._8_8_);
                    afVar165 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                         ((binary_op_rpow *)&local_164,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar105._0_8_ = afVar165._0_8_;
                    auVar105._8_56_ = auVar155;
                    *(undefined1 (*) [16])*(__m512 *)pfVar94 = auVar105._0_16_;
                    pfVar96 = pfVar96 + 4;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pfVar94 = *(__m512 *)pfVar94 + 4;
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                    pMVar79 = extraout_RAX_01;
                  } while (uVar77 != 0);
                }
                if ((char)local_134 == '\0') {
                  lVar90 = 0;
                  lVar92 = 0;
                  do {
                    fVar130 = powf(*(float *)((long)ppvVar84 + lVar92 * 4),pfVar96[lVar92]);
                    (*(__m512 *)pfVar94)[lVar92] = fVar130;
                    lVar92 = lVar92 + 1;
                    lVar90 = lVar90 + -4;
                  } while ((int)local_160 != (int)lVar92);
                  pfVar94 = (float *)((long)pfVar94 - lVar90);
                  pfVar96 = (float *)((long)pfVar96 - lVar90);
                  pMVar79 = extraout_RAX_02;
                  uVar82 = local_160;
                }
                iVar78 = (int)local_140 + 1;
              } while (iVar78 != (int)local_150);
            }
            local_10c = local_10c + 1;
          } while (local_10c != local_11c);
        }
        in_EAX = (int)pMVar79;
        local_118 = local_118 + 1;
      } while (local_118 != local_108);
    }
    break;
  case 10:
    local_160 = (ulong)(uint)a->w;
    local_150 = (ulong)(uint)a->h;
    local_11c = a->d;
    local_108 = (ulong)(uint)a->c;
    local_134 = a->elempack;
    if (0 < a->h && a->dims == 2) {
      bVar3 = a->w < 1;
      local_148 = CONCAT71(local_148._1_7_,local_134 != 0x10 || bVar3);
      local_161 = local_134 != 8 || bVar3;
      local_162 = local_134 != 4 || bVar3;
      local_163 = local_134 != 1 || bVar3;
      uVar82 = 0;
      auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      do {
        auVar164 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar93 = (undefined1 (*) [64])
                   ((long)local_158->w * uVar82 * local_158->elemsize + (long)local_158->data);
        puVar86 = (uint *)local_130->data;
        pauVar97 = (undefined1 (*) [32])
                   ((long)local_128->w * uVar82 * local_128->elemsize + (long)local_128->data);
        uVar80 = local_160;
        auVar119 = in_ZMM3;
        if ((char)local_148 == '\0') {
          do {
            auVar122 = *pauVar93;
            auVar118 = vbroadcastss_avx512f(ZEXT416(*puVar86));
            uVar52 = vcmpps_avx512f(auVar122,auVar164,1);
            auVar68._8_4_ = 0xc0490fdb;
            auVar68._0_8_ = 0xc0490fdbc0490fdb;
            auVar68._12_4_ = 0xc0490fdb;
            auVar68._16_4_ = 0xc0490fdb;
            auVar68._20_4_ = 0xc0490fdb;
            auVar68._24_4_ = 0xc0490fdb;
            auVar68._28_4_ = 0xc0490fdb;
            auVar68._32_4_ = 0xc0490fdb;
            auVar68._36_4_ = 0xc0490fdb;
            auVar68._40_4_ = 0xc0490fdb;
            auVar68._44_4_ = 0xc0490fdb;
            auVar68._48_4_ = 0xc0490fdb;
            auVar68._52_4_ = 0xc0490fdb;
            auVar68._56_4_ = 0xc0490fdb;
            auVar68._60_4_ = 0xc0490fdb;
            auVar115 = vblendmps_avx512f(auVar101,auVar68);
            bVar3 = (bool)((byte)uVar52 & 1);
            in_ZMM3._0_4_ = (uint)bVar3 * auVar115._0_4_ | (uint)!bVar3 * auVar119._0_4_;
            bVar3 = (bool)((byte)(uVar52 >> 1) & 1);
            in_ZMM3._4_4_ = (uint)bVar3 * auVar115._4_4_ | (uint)!bVar3 * auVar119._4_4_;
            bVar3 = (bool)((byte)(uVar52 >> 2) & 1);
            in_ZMM3._8_4_ = (uint)bVar3 * auVar115._8_4_ | (uint)!bVar3 * auVar119._8_4_;
            bVar3 = (bool)((byte)(uVar52 >> 3) & 1);
            in_ZMM3._12_4_ = (uint)bVar3 * auVar115._12_4_ | (uint)!bVar3 * auVar119._12_4_;
            bVar3 = (bool)((byte)(uVar52 >> 4) & 1);
            in_ZMM3._16_4_ = (uint)bVar3 * auVar115._16_4_ | (uint)!bVar3 * auVar119._16_4_;
            bVar3 = (bool)((byte)(uVar52 >> 5) & 1);
            in_ZMM3._20_4_ = (uint)bVar3 * auVar115._20_4_ | (uint)!bVar3 * auVar119._20_4_;
            bVar3 = (bool)((byte)(uVar52 >> 6) & 1);
            in_ZMM3._24_4_ = (uint)bVar3 * auVar115._24_4_ | (uint)!bVar3 * auVar119._24_4_;
            bVar3 = (bool)((byte)(uVar52 >> 7) & 1);
            in_ZMM3._28_4_ = (uint)bVar3 * auVar115._28_4_ | (uint)!bVar3 * auVar119._28_4_;
            bVar3 = (bool)((byte)(uVar52 >> 8) & 1);
            in_ZMM3._32_4_ = (uint)bVar3 * auVar115._32_4_ | (uint)!bVar3 * auVar119._32_4_;
            bVar3 = (bool)((byte)(uVar52 >> 9) & 1);
            in_ZMM3._36_4_ = (uint)bVar3 * auVar115._36_4_ | (uint)!bVar3 * auVar119._36_4_;
            bVar3 = (bool)((byte)(uVar52 >> 10) & 1);
            in_ZMM3._40_4_ = (uint)bVar3 * auVar115._40_4_ | (uint)!bVar3 * auVar119._40_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xb) & 1);
            in_ZMM3._44_4_ = (uint)bVar3 * auVar115._44_4_ | (uint)!bVar3 * auVar119._44_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xc) & 1);
            in_ZMM3._48_4_ = (uint)bVar3 * auVar115._48_4_ | (uint)!bVar3 * auVar119._48_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xd) & 1);
            in_ZMM3._52_4_ = (uint)bVar3 * auVar115._52_4_ | (uint)!bVar3 * auVar119._52_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xe) & 1);
            in_ZMM3._56_4_ = (uint)bVar3 * auVar115._56_4_ | (uint)!bVar3 * auVar119._56_4_;
            bVar3 = SUB81(uVar52 >> 0xf,0);
            in_ZMM3._60_4_ = (uint)bVar3 * auVar115._60_4_ | (uint)!bVar3 * auVar119._60_4_;
            auVar119 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / auVar118._0_4_)));
            auVar119 = vmulps_avx512f(auVar122,auVar119);
            auVar115 = vandps_avx512dq(auVar119,auVar102);
            uVar52 = vcmpps_avx512f(auVar103,auVar115,1);
            auVar116 = vmaxps_avx512f(auVar115,auVar103);
            auVar69._8_4_ = 0xbf800000;
            auVar69._0_8_ = 0xbf800000bf800000;
            auVar69._12_4_ = 0xbf800000;
            auVar69._16_4_ = 0xbf800000;
            auVar69._20_4_ = 0xbf800000;
            auVar69._24_4_ = 0xbf800000;
            auVar69._28_4_ = 0xbf800000;
            auVar69._32_4_ = 0xbf800000;
            auVar69._36_4_ = 0xbf800000;
            auVar69._40_4_ = 0xbf800000;
            auVar69._44_4_ = 0xbf800000;
            auVar69._48_4_ = 0xbf800000;
            auVar69._52_4_ = 0xbf800000;
            auVar69._56_4_ = 0xbf800000;
            auVar69._60_4_ = 0xbf800000;
            auVar117 = vblendmps_avx512f(auVar115,auVar69);
            bVar3 = (bool)((byte)uVar52 & 1);
            auVar126._0_4_ = (uint)bVar3 * auVar117._0_4_ | (uint)!bVar3 * auVar115._0_4_;
            bVar3 = (bool)((byte)(uVar52 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar3 * auVar117._4_4_ | (uint)!bVar3 * auVar115._4_4_;
            bVar3 = (bool)((byte)(uVar52 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar3 * auVar117._8_4_ | (uint)!bVar3 * auVar115._8_4_;
            bVar3 = (bool)((byte)(uVar52 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar3 * auVar117._12_4_ | (uint)!bVar3 * auVar115._12_4_;
            bVar3 = (bool)((byte)(uVar52 >> 4) & 1);
            auVar126._16_4_ = (uint)bVar3 * auVar117._16_4_ | (uint)!bVar3 * auVar115._16_4_;
            bVar3 = (bool)((byte)(uVar52 >> 5) & 1);
            auVar126._20_4_ = (uint)bVar3 * auVar117._20_4_ | (uint)!bVar3 * auVar115._20_4_;
            bVar3 = (bool)((byte)(uVar52 >> 6) & 1);
            auVar126._24_4_ = (uint)bVar3 * auVar117._24_4_ | (uint)!bVar3 * auVar115._24_4_;
            bVar3 = (bool)((byte)(uVar52 >> 7) & 1);
            auVar126._28_4_ = (uint)bVar3 * auVar117._28_4_ | (uint)!bVar3 * auVar115._28_4_;
            bVar20 = (byte)(uVar52 >> 8);
            bVar3 = (bool)(bVar20 & 1);
            auVar126._32_4_ = (uint)bVar3 * auVar117._32_4_ | (uint)!bVar3 * auVar115._32_4_;
            bVar3 = (bool)((byte)(uVar52 >> 9) & 1);
            auVar126._36_4_ = (uint)bVar3 * auVar117._36_4_ | (uint)!bVar3 * auVar115._36_4_;
            bVar3 = (bool)((byte)(uVar52 >> 10) & 1);
            auVar126._40_4_ = (uint)bVar3 * auVar117._40_4_ | (uint)!bVar3 * auVar115._40_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xb) & 1);
            auVar126._44_4_ = (uint)bVar3 * auVar117._44_4_ | (uint)!bVar3 * auVar115._44_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xc) & 1);
            auVar126._48_4_ = (uint)bVar3 * auVar117._48_4_ | (uint)!bVar3 * auVar115._48_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xd) & 1);
            auVar126._52_4_ = (uint)bVar3 * auVar117._52_4_ | (uint)!bVar3 * auVar115._52_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xe) & 1);
            auVar126._56_4_ = (uint)bVar3 * auVar117._56_4_ | (uint)!bVar3 * auVar115._56_4_;
            bVar3 = SUB81(uVar52 >> 0xf,0);
            auVar126._60_4_ = (uint)bVar3 * auVar117._60_4_ | (uint)!bVar3 * auVar115._60_4_;
            auVar115 = vrcp14ps_avx512f(auVar116);
            uVar53 = vcmpps_avx512f(auVar122,auVar164,4);
            auVar117 = vmulps_avx512f(auVar126,auVar115);
            auVar116 = vfmsub213ps_avx512f(auVar116,auVar117,auVar126);
            auVar115 = vfnmadd213ps_avx512f(auVar116,auVar115,auVar117);
            uVar54 = vcmpps_avx512f(auVar118,auVar164,4);
            auVar116 = vmulps_avx512f(auVar115,auVar115);
            auVar117 = vmulps_avx512f(auVar116,auVar116);
            auVar120 = vfmadd213ps_avx512f(auVar104,auVar117,auVar105);
            auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar106);
            auVar121 = vfmadd213ps_avx512f(auVar108,auVar117,auVar109);
            auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar107);
            auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar110);
            auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar111);
            auVar117 = vfmadd213ps_avx512f(auVar121,auVar117,auVar103);
            uVar55 = vcmpps_avx512f(auVar118,auVar164,1);
            auVar116 = vfmadd231ps_avx512f(auVar117,auVar116,auVar120);
            auVar115 = vmulps_avx512f(auVar116,auVar115);
            auVar116 = vaddps_avx512f(auVar115,auVar112);
            bVar3 = (bool)((byte)uVar52 & 1);
            auVar127._0_4_ = (uint)bVar3 * auVar116._0_4_ | (uint)!bVar3 * auVar115._0_4_;
            bVar3 = (bool)((byte)(uVar52 >> 1) & 1);
            auVar127._4_4_ = (uint)bVar3 * auVar116._4_4_ | (uint)!bVar3 * auVar115._4_4_;
            bVar3 = (bool)((byte)(uVar52 >> 2) & 1);
            auVar127._8_4_ = (uint)bVar3 * auVar116._8_4_ | (uint)!bVar3 * auVar115._8_4_;
            bVar3 = (bool)((byte)(uVar52 >> 3) & 1);
            auVar127._12_4_ = (uint)bVar3 * auVar116._12_4_ | (uint)!bVar3 * auVar115._12_4_;
            bVar3 = (bool)((byte)(uVar52 >> 4) & 1);
            auVar127._16_4_ = (uint)bVar3 * auVar116._16_4_ | (uint)!bVar3 * auVar115._16_4_;
            bVar3 = (bool)((byte)(uVar52 >> 5) & 1);
            auVar127._20_4_ = (uint)bVar3 * auVar116._20_4_ | (uint)!bVar3 * auVar115._20_4_;
            bVar3 = (bool)((byte)(uVar52 >> 6) & 1);
            auVar127._24_4_ = (uint)bVar3 * auVar116._24_4_ | (uint)!bVar3 * auVar115._24_4_;
            bVar3 = (bool)((byte)(uVar52 >> 7) & 1);
            auVar127._28_4_ = (uint)bVar3 * auVar116._28_4_ | (uint)!bVar3 * auVar115._28_4_;
            bVar3 = (bool)(bVar20 & 1);
            auVar127._32_4_ = (uint)bVar3 * auVar116._32_4_ | (uint)!bVar3 * auVar115._32_4_;
            bVar3 = (bool)((byte)(uVar52 >> 9) & 1);
            auVar127._36_4_ = (uint)bVar3 * auVar116._36_4_ | (uint)!bVar3 * auVar115._36_4_;
            bVar3 = (bool)((byte)(uVar52 >> 10) & 1);
            auVar127._40_4_ = (uint)bVar3 * auVar116._40_4_ | (uint)!bVar3 * auVar115._40_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xb) & 1);
            auVar127._44_4_ = (uint)bVar3 * auVar116._44_4_ | (uint)!bVar3 * auVar115._44_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xc) & 1);
            auVar127._48_4_ = (uint)bVar3 * auVar116._48_4_ | (uint)!bVar3 * auVar115._48_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xd) & 1);
            auVar127._52_4_ = (uint)bVar3 * auVar116._52_4_ | (uint)!bVar3 * auVar115._52_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xe) & 1);
            auVar127._56_4_ = (uint)bVar3 * auVar116._56_4_ | (uint)!bVar3 * auVar115._56_4_;
            bVar3 = SUB81(uVar52 >> 0xf,0);
            auVar127._60_4_ = (uint)bVar3 * auVar116._60_4_ | (uint)!bVar3 * auVar115._60_4_;
            auVar119 = vpternlogd_avx512f(auVar127,auVar119,auVar100,0xf8);
            auVar115 = vaddps_avx512f(auVar119,in_ZMM3);
            bVar3 = (bool)((byte)uVar55 & 1);
            bVar6 = (bool)((byte)(uVar55 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar55 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar55 >> 5) & 1);
            bVar22 = (bool)((byte)(uVar55 >> 6) & 1);
            bVar25 = (bool)((byte)(uVar55 >> 7) & 1);
            bVar28 = (bool)((byte)(uVar55 >> 8) & 1);
            bVar37 = (bool)((byte)(uVar55 >> 9) & 1);
            bVar43 = (bool)((byte)(uVar55 >> 10) & 1);
            bVar29 = (bool)((byte)(uVar55 >> 0xb) & 1);
            bVar34 = (bool)((byte)(uVar55 >> 0xc) & 1);
            bVar39 = (bool)((byte)(uVar55 >> 0xd) & 1);
            bVar44 = (bool)((byte)(uVar55 >> 0xe) & 1);
            bVar49 = SUB81(uVar55 >> 0xf,0);
            auVar118 = vpternlogd_avx512f(auVar118,auVar100,auVar113,0xea);
            uVar52 = vcmpps_avx512f(auVar118,auVar164,1);
            auVar122 = vpternlogd_avx512f(auVar122,auVar100,auVar114,0xea);
            bVar4 = (bool)((byte)uVar54 & 1);
            bVar7 = (bool)((byte)(uVar54 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar54 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar54 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar54 >> 4) & 1);
            bVar19 = (bool)((byte)(uVar54 >> 5) & 1);
            bVar23 = (bool)((byte)(uVar54 >> 6) & 1);
            bVar26 = (bool)((byte)(uVar54 >> 7) & 1);
            bVar32 = (bool)((byte)(uVar54 >> 8) & 1);
            bVar38 = (bool)((byte)(uVar54 >> 9) & 1);
            bVar47 = (bool)((byte)(uVar54 >> 10) & 1);
            bVar30 = (bool)((byte)(uVar54 >> 0xb) & 1);
            bVar35 = (bool)((byte)(uVar54 >> 0xc) & 1);
            bVar40 = (bool)((byte)(uVar54 >> 0xd) & 1);
            bVar45 = (bool)((byte)(uVar54 >> 0xe) & 1);
            bVar50 = SUB81(uVar54 >> 0xf,0);
            bVar5 = (bool)((byte)uVar53 & 1);
            bVar8 = (bool)((byte)(uVar53 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar53 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar53 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar53 >> 4) & 1);
            bVar21 = (bool)((byte)(uVar53 >> 5) & 1);
            bVar24 = (bool)((byte)(uVar53 >> 6) & 1);
            bVar27 = (bool)((byte)(uVar53 >> 7) & 1);
            bVar33 = (bool)((byte)(uVar53 >> 8) & 1);
            bVar42 = (bool)((byte)(uVar53 >> 9) & 1);
            bVar48 = (bool)((byte)(uVar53 >> 10) & 1);
            bVar31 = (bool)((byte)(uVar53 >> 0xb) & 1);
            bVar36 = (bool)((byte)(uVar53 >> 0xc) & 1);
            bVar41 = (bool)((byte)(uVar53 >> 0xd) & 1);
            bVar46 = (bool)((byte)(uVar53 >> 0xe) & 1);
            bVar51 = SUB81(uVar53 >> 0xf,0);
            *(uint *)*pauVar97 =
                 (uint)bVar5 *
                 ((uint)bVar4 * ((uint)bVar3 * auVar115._0_4_ | (uint)!bVar3 * auVar119._0_4_) |
                 (uint)!bVar4 * auVar122._0_4_) |
                 (uint)!bVar5 * (uint)((byte)uVar52 & 1) * auVar101._0_4_;
            *(uint *)((long)*pauVar97 + 4) =
                 (uint)bVar8 *
                 ((uint)bVar7 * ((uint)bVar6 * auVar115._4_4_ | (uint)!bVar6 * auVar119._4_4_) |
                 (uint)!bVar7 * auVar122._4_4_) |
                 (uint)!bVar8 * (uint)((byte)(uVar52 >> 1) & 1) * auVar101._4_4_;
            *(uint *)((long)*pauVar97 + 8) =
                 (uint)bVar11 *
                 ((uint)bVar10 * ((uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * auVar119._8_4_) |
                 (uint)!bVar10 * auVar122._8_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar52 >> 2) & 1) * auVar101._8_4_;
            *(uint *)((long)*pauVar97 + 0xc) =
                 (uint)bVar14 *
                 ((uint)bVar13 * ((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar119._12_4_)
                 | (uint)!bVar13 * auVar122._12_4_) |
                 (uint)!bVar14 * (uint)((byte)(uVar52 >> 3) & 1) * auVar101._12_4_;
            *(uint *)((long)*pauVar97 + 0x10) =
                 (uint)bVar17 *
                 ((uint)bVar16 * ((uint)bVar15 * auVar115._16_4_ | (uint)!bVar15 * auVar119._16_4_)
                 | (uint)!bVar16 * auVar122._16_4_) |
                 (uint)!bVar17 * (uint)((byte)(uVar52 >> 4) & 1) * auVar101._16_4_;
            *(uint *)((long)*pauVar97 + 0x14) =
                 (uint)bVar21 *
                 ((uint)bVar19 * ((uint)bVar18 * auVar115._20_4_ | (uint)!bVar18 * auVar119._20_4_)
                 | (uint)!bVar19 * auVar122._20_4_) |
                 (uint)!bVar21 * (uint)((byte)(uVar52 >> 5) & 1) * auVar101._20_4_;
            *(uint *)((long)*pauVar97 + 0x18) =
                 (uint)bVar24 *
                 ((uint)bVar23 * ((uint)bVar22 * auVar115._24_4_ | (uint)!bVar22 * auVar119._24_4_)
                 | (uint)!bVar23 * auVar122._24_4_) |
                 (uint)!bVar24 * (uint)((byte)(uVar52 >> 6) & 1) * auVar101._24_4_;
            *(uint *)((long)*pauVar97 + 0x1c) =
                 (uint)bVar27 *
                 ((uint)bVar26 * ((uint)bVar25 * auVar115._28_4_ | (uint)!bVar25 * auVar119._28_4_)
                 | (uint)!bVar26 * auVar122._28_4_) |
                 (uint)!bVar27 * (uint)((byte)(uVar52 >> 7) & 1) * auVar101._28_4_;
            *(uint *)pauVar97[1] =
                 (uint)bVar33 *
                 ((uint)bVar32 * ((uint)bVar28 * auVar115._32_4_ | (uint)!bVar28 * auVar119._32_4_)
                 | (uint)!bVar32 * auVar122._32_4_) |
                 (uint)!bVar33 * (uint)((byte)(uVar52 >> 8) & 1) * auVar101._32_4_;
            *(uint *)(pauVar97[1] + 4) =
                 (uint)bVar42 *
                 ((uint)bVar38 * ((uint)bVar37 * auVar115._36_4_ | (uint)!bVar37 * auVar119._36_4_)
                 | (uint)!bVar38 * auVar122._36_4_) |
                 (uint)!bVar42 * (uint)((byte)(uVar52 >> 9) & 1) * auVar101._36_4_;
            *(uint *)(pauVar97[1] + 8) =
                 (uint)bVar48 *
                 ((uint)bVar47 * ((uint)bVar43 * auVar115._40_4_ | (uint)!bVar43 * auVar119._40_4_)
                 | (uint)!bVar47 * auVar122._40_4_) |
                 (uint)!bVar48 * (uint)((byte)(uVar52 >> 10) & 1) * auVar101._40_4_;
            *(uint *)(pauVar97[1] + 0xc) =
                 (uint)bVar31 *
                 ((uint)bVar30 * ((uint)bVar29 * auVar115._44_4_ | (uint)!bVar29 * auVar119._44_4_)
                 | (uint)!bVar30 * auVar122._44_4_) |
                 (uint)!bVar31 * (uint)((byte)(uVar52 >> 0xb) & 1) * auVar101._44_4_;
            *(uint *)(pauVar97[1] + 0x10) =
                 (uint)bVar36 *
                 ((uint)bVar35 * ((uint)bVar34 * auVar115._48_4_ | (uint)!bVar34 * auVar119._48_4_)
                 | (uint)!bVar35 * auVar122._48_4_) |
                 (uint)!bVar36 * (uint)((byte)(uVar52 >> 0xc) & 1) * auVar101._48_4_;
            *(uint *)(pauVar97[1] + 0x14) =
                 (uint)bVar41 *
                 ((uint)bVar40 * ((uint)bVar39 * auVar115._52_4_ | (uint)!bVar39 * auVar119._52_4_)
                 | (uint)!bVar40 * auVar122._52_4_) |
                 (uint)!bVar41 * (uint)((byte)(uVar52 >> 0xd) & 1) * auVar101._52_4_;
            *(uint *)(pauVar97[1] + 0x18) =
                 (uint)bVar46 *
                 ((uint)bVar45 * ((uint)bVar44 * auVar115._56_4_ | (uint)!bVar44 * auVar119._56_4_)
                 | (uint)!bVar45 * auVar122._56_4_) |
                 (uint)!bVar46 * (uint)((byte)(uVar52 >> 0xe) & 1) * auVar101._56_4_;
            *(uint *)(pauVar97[1] + 0x1c) =
                 (uint)bVar51 *
                 ((uint)bVar50 * ((uint)bVar49 * auVar115._60_4_ | (uint)!bVar49 * auVar119._60_4_)
                 | (uint)!bVar50 * auVar122._60_4_) |
                 (uint)!bVar51 * (uint)(byte)(uVar52 >> 0xf) * auVar101._60_4_;
            pauVar93 = pauVar93 + 1;
            puVar86 = puVar86 + 1;
            pauVar97 = pauVar97 + 2;
            uVar77 = (int)uVar80 - 1;
            uVar80 = (ulong)uVar77;
            auVar119 = in_ZMM3;
          } while (uVar77 != 0);
        }
        local_140 = uVar82;
        if (local_161 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])*pauVar93;
            afStack_b8 = *(float (*) [2])(*pauVar93 + 8);
            afStack_b0 = *(float (*) [2])(*pauVar93 + 0x10);
            afStack_a8 = *(float (*) [2])(*pauVar93 + 0x18);
            uVar77 = *puVar86;
            auVar153._4_4_ = uVar77;
            auVar153._0_4_ = uVar77;
            auVar153._8_4_ = uVar77;
            auVar153._12_4_ = uVar77;
            auVar153._16_4_ = uVar77;
            auVar153._20_4_ = uVar77;
            auVar153._24_4_ = uVar77;
            auVar153._28_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            local_100[4] = (float)uVar77;
            local_100[5] = (float)uVar77;
            local_100[6] = (float)uVar77;
            local_100[7] = (float)uVar77;
            BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                      ((binary_op_atan2 *)&local_164,(__m256 *)local_c0,(__m256 *)local_100);
            *pauVar97 = auVar153;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            puVar86 = puVar86 + 1;
            pauVar97 = pauVar97 + 1;
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        if (local_162 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])*pauVar93;
            afStack_b8 = *(float (*) [2])(*pauVar93 + 8);
            uVar77 = *puVar86;
            auVar142._4_4_ = uVar77;
            auVar142._0_4_ = uVar77;
            auVar142._8_4_ = uVar77;
            auVar142._12_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            auVar155 = ZEXT856(auVar142._8_8_);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            afVar165 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                 ((binary_op_atan2 *)&local_164,(__m128 *)local_c0,
                                  (__m128 *)local_100);
            auVar102._0_8_ = afVar165._0_8_;
            auVar102._8_56_ = auVar155;
            *(undefined1 (*) [16])*pauVar97 = auVar102._0_16_;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            puVar86 = puVar86 + 1;
            pauVar97 = (undefined1 (*) [32])((long)*pauVar97 + 0x10);
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        uVar82 = local_160;
        if (local_163 == '\0') {
          lVar90 = 0;
          do {
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            fVar130 = atan2f(*(float *)(*pauVar93 + lVar90 * 4),(float)puVar86[lVar90]);
            *(float *)((long)*pauVar97 + lVar90 * 4) = fVar130;
            lVar90 = lVar90 + 1;
          } while ((int)uVar82 != (int)lVar90);
        }
        uVar82 = local_140 + 1;
        auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      } while (uVar82 != local_150);
    }
    uVar77 = local_158->dims - 3;
    uVar72 = (undefined3)(uVar77 >> 8);
    in_EAX = CONCAT31(uVar72,uVar77 < 2);
    if (0 < (int)local_108 && uVar77 < 2) {
      bVar3 = (int)local_160 < 1;
      pMVar79 = (Mat *)(ulong)CONCAT31(uVar72,bVar3);
      local_161 = local_134 != 0x10 || bVar3;
      local_162 = local_134 != 8 || bVar3;
      local_163 = local_134 != 4 || bVar3;
      local_134 = CONCAT31(local_134._1_3_,local_134 != 1 || bVar3);
      local_118 = 0;
      auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      uVar82 = local_160;
      do {
        if (0 < local_11c) {
          pauVar97 = (undefined1 (*) [32])
                     (local_128->cstep * local_118 * local_128->elemsize + (long)local_128->data);
          pauVar93 = (undefined1 (*) [64])
                     (local_158->cstep * local_118 * local_158->elemsize + (long)local_158->data);
          local_10c = 0;
          pMVar79 = local_158;
          do {
            if (0 < (int)local_150) {
              iVar78 = local_130->d + -1;
              if (local_10c <= iVar78) {
                iVar78 = local_10c;
              }
              local_148 = (long)iVar78;
              iVar78 = 0;
              do {
                iVar81 = local_130->h + -1;
                local_140 = CONCAT44(local_140._4_4_,iVar78);
                if (iVar78 <= iVar81) {
                  iVar81 = iVar78;
                }
                lVar90 = (long)local_130->w * local_130->elemsize;
                pMVar79 = (Mat *)(local_130->h * local_148 * lVar90 + (long)local_130->data);
                ppvVar84 = (void **)((long)&pMVar79->data + iVar81 * lVar90);
                if (local_161 == '\0') {
                  pMVar79 = (Mat *)(uVar82 & 0xffffffff);
                  auVar164 = in_ZMM3;
                  do {
                    auVar122 = *pauVar93;
                    auVar118 = vbroadcastss_avx512f(ZEXT416((uint)*(float *)ppvVar84));
                    uVar80 = vcmpps_avx512f(auVar122,auVar119,1);
                    auVar70._8_4_ = 0xc0490fdb;
                    auVar70._0_8_ = 0xc0490fdbc0490fdb;
                    auVar70._12_4_ = 0xc0490fdb;
                    auVar70._16_4_ = 0xc0490fdb;
                    auVar70._20_4_ = 0xc0490fdb;
                    auVar70._24_4_ = 0xc0490fdb;
                    auVar70._28_4_ = 0xc0490fdb;
                    auVar70._32_4_ = 0xc0490fdb;
                    auVar70._36_4_ = 0xc0490fdb;
                    auVar70._40_4_ = 0xc0490fdb;
                    auVar70._44_4_ = 0xc0490fdb;
                    auVar70._48_4_ = 0xc0490fdb;
                    auVar70._52_4_ = 0xc0490fdb;
                    auVar70._56_4_ = 0xc0490fdb;
                    auVar70._60_4_ = 0xc0490fdb;
                    auVar115 = vblendmps_avx512f(auVar101,auVar70);
                    bVar3 = (bool)((byte)uVar80 & 1);
                    in_ZMM3._0_4_ = (uint)bVar3 * auVar115._0_4_ | (uint)!bVar3 * auVar164._0_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 1) & 1);
                    in_ZMM3._4_4_ = (uint)bVar3 * auVar115._4_4_ | (uint)!bVar3 * auVar164._4_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 2) & 1);
                    in_ZMM3._8_4_ = (uint)bVar3 * auVar115._8_4_ | (uint)!bVar3 * auVar164._8_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 3) & 1);
                    in_ZMM3._12_4_ = (uint)bVar3 * auVar115._12_4_ | (uint)!bVar3 * auVar164._12_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 4) & 1);
                    in_ZMM3._16_4_ = (uint)bVar3 * auVar115._16_4_ | (uint)!bVar3 * auVar164._16_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 5) & 1);
                    in_ZMM3._20_4_ = (uint)bVar3 * auVar115._20_4_ | (uint)!bVar3 * auVar164._20_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 6) & 1);
                    in_ZMM3._24_4_ = (uint)bVar3 * auVar115._24_4_ | (uint)!bVar3 * auVar164._24_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 7) & 1);
                    in_ZMM3._28_4_ = (uint)bVar3 * auVar115._28_4_ | (uint)!bVar3 * auVar164._28_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 8) & 1);
                    in_ZMM3._32_4_ = (uint)bVar3 * auVar115._32_4_ | (uint)!bVar3 * auVar164._32_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 9) & 1);
                    in_ZMM3._36_4_ = (uint)bVar3 * auVar115._36_4_ | (uint)!bVar3 * auVar164._36_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 10) & 1);
                    in_ZMM3._40_4_ = (uint)bVar3 * auVar115._40_4_ | (uint)!bVar3 * auVar164._40_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xb) & 1);
                    in_ZMM3._44_4_ = (uint)bVar3 * auVar115._44_4_ | (uint)!bVar3 * auVar164._44_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xc) & 1);
                    in_ZMM3._48_4_ = (uint)bVar3 * auVar115._48_4_ | (uint)!bVar3 * auVar164._48_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xd) & 1);
                    in_ZMM3._52_4_ = (uint)bVar3 * auVar115._52_4_ | (uint)!bVar3 * auVar164._52_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xe) & 1);
                    in_ZMM3._56_4_ = (uint)bVar3 * auVar115._56_4_ | (uint)!bVar3 * auVar164._56_4_;
                    bVar3 = SUB81(uVar80 >> 0xf,0);
                    in_ZMM3._60_4_ = (uint)bVar3 * auVar115._60_4_ | (uint)!bVar3 * auVar164._60_4_;
                    auVar164 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / auVar118._0_4_)));
                    auVar164 = vmulps_avx512f(auVar122,auVar164);
                    auVar115 = vandps_avx512dq(auVar164,auVar102);
                    uVar80 = vcmpps_avx512f(auVar103,auVar115,1);
                    auVar116 = vmaxps_avx512f(auVar115,auVar103);
                    auVar71._8_4_ = 0xbf800000;
                    auVar71._0_8_ = 0xbf800000bf800000;
                    auVar71._12_4_ = 0xbf800000;
                    auVar71._16_4_ = 0xbf800000;
                    auVar71._20_4_ = 0xbf800000;
                    auVar71._24_4_ = 0xbf800000;
                    auVar71._28_4_ = 0xbf800000;
                    auVar71._32_4_ = 0xbf800000;
                    auVar71._36_4_ = 0xbf800000;
                    auVar71._40_4_ = 0xbf800000;
                    auVar71._44_4_ = 0xbf800000;
                    auVar71._48_4_ = 0xbf800000;
                    auVar71._52_4_ = 0xbf800000;
                    auVar71._56_4_ = 0xbf800000;
                    auVar71._60_4_ = 0xbf800000;
                    auVar117 = vblendmps_avx512f(auVar115,auVar71);
                    bVar3 = (bool)((byte)uVar80 & 1);
                    auVar128._0_4_ = (uint)bVar3 * auVar117._0_4_ | (uint)!bVar3 * auVar115._0_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar128._4_4_ = (uint)bVar3 * auVar117._4_4_ | (uint)!bVar3 * auVar115._4_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar128._8_4_ = (uint)bVar3 * auVar117._8_4_ | (uint)!bVar3 * auVar115._8_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 3) & 1);
                    auVar128._12_4_ = (uint)bVar3 * auVar117._12_4_ | (uint)!bVar3 * auVar115._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 4) & 1);
                    auVar128._16_4_ = (uint)bVar3 * auVar117._16_4_ | (uint)!bVar3 * auVar115._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 5) & 1);
                    auVar128._20_4_ = (uint)bVar3 * auVar117._20_4_ | (uint)!bVar3 * auVar115._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 6) & 1);
                    auVar128._24_4_ = (uint)bVar3 * auVar117._24_4_ | (uint)!bVar3 * auVar115._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 7) & 1);
                    auVar128._28_4_ = (uint)bVar3 * auVar117._28_4_ | (uint)!bVar3 * auVar115._28_4_
                    ;
                    bVar20 = (byte)(uVar80 >> 8);
                    bVar3 = (bool)(bVar20 & 1);
                    auVar128._32_4_ = (uint)bVar3 * auVar117._32_4_ | (uint)!bVar3 * auVar115._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 9) & 1);
                    auVar128._36_4_ = (uint)bVar3 * auVar117._36_4_ | (uint)!bVar3 * auVar115._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 10) & 1);
                    auVar128._40_4_ = (uint)bVar3 * auVar117._40_4_ | (uint)!bVar3 * auVar115._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xb) & 1);
                    auVar128._44_4_ = (uint)bVar3 * auVar117._44_4_ | (uint)!bVar3 * auVar115._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xc) & 1);
                    auVar128._48_4_ = (uint)bVar3 * auVar117._48_4_ | (uint)!bVar3 * auVar115._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xd) & 1);
                    auVar128._52_4_ = (uint)bVar3 * auVar117._52_4_ | (uint)!bVar3 * auVar115._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xe) & 1);
                    auVar128._56_4_ = (uint)bVar3 * auVar117._56_4_ | (uint)!bVar3 * auVar115._56_4_
                    ;
                    bVar3 = SUB81(uVar80 >> 0xf,0);
                    auVar128._60_4_ = (uint)bVar3 * auVar117._60_4_ | (uint)!bVar3 * auVar115._60_4_
                    ;
                    auVar115 = vrcp14ps_avx512f(auVar116);
                    uVar52 = vcmpps_avx512f(auVar122,auVar119,4);
                    auVar117 = vmulps_avx512f(auVar128,auVar115);
                    auVar116 = vfmsub213ps_avx512f(auVar116,auVar117,auVar128);
                    auVar115 = vfnmadd213ps_avx512f(auVar116,auVar115,auVar117);
                    uVar53 = vcmpps_avx512f(auVar118,auVar119,4);
                    auVar116 = vmulps_avx512f(auVar115,auVar115);
                    auVar117 = vmulps_avx512f(auVar116,auVar116);
                    auVar120 = vfmadd213ps_avx512f(auVar104,auVar117,auVar105);
                    auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar106);
                    auVar121 = vfmadd213ps_avx512f(auVar108,auVar117,auVar109);
                    auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar107);
                    auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar110);
                    auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar111);
                    auVar117 = vfmadd213ps_avx512f(auVar121,auVar117,auVar103);
                    uVar54 = vcmpps_avx512f(auVar118,auVar119,1);
                    auVar116 = vfmadd231ps_avx512f(auVar117,auVar116,auVar120);
                    auVar115 = vmulps_avx512f(auVar116,auVar115);
                    auVar116 = vaddps_avx512f(auVar115,auVar112);
                    bVar3 = (bool)((byte)uVar80 & 1);
                    auVar129._0_4_ = (uint)bVar3 * auVar116._0_4_ | (uint)!bVar3 * auVar115._0_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar129._4_4_ = (uint)bVar3 * auVar116._4_4_ | (uint)!bVar3 * auVar115._4_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar129._8_4_ = (uint)bVar3 * auVar116._8_4_ | (uint)!bVar3 * auVar115._8_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 3) & 1);
                    auVar129._12_4_ = (uint)bVar3 * auVar116._12_4_ | (uint)!bVar3 * auVar115._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 4) & 1);
                    auVar129._16_4_ = (uint)bVar3 * auVar116._16_4_ | (uint)!bVar3 * auVar115._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 5) & 1);
                    auVar129._20_4_ = (uint)bVar3 * auVar116._20_4_ | (uint)!bVar3 * auVar115._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 6) & 1);
                    auVar129._24_4_ = (uint)bVar3 * auVar116._24_4_ | (uint)!bVar3 * auVar115._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 7) & 1);
                    auVar129._28_4_ = (uint)bVar3 * auVar116._28_4_ | (uint)!bVar3 * auVar115._28_4_
                    ;
                    bVar3 = (bool)(bVar20 & 1);
                    auVar129._32_4_ = (uint)bVar3 * auVar116._32_4_ | (uint)!bVar3 * auVar115._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 9) & 1);
                    auVar129._36_4_ = (uint)bVar3 * auVar116._36_4_ | (uint)!bVar3 * auVar115._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 10) & 1);
                    auVar129._40_4_ = (uint)bVar3 * auVar116._40_4_ | (uint)!bVar3 * auVar115._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xb) & 1);
                    auVar129._44_4_ = (uint)bVar3 * auVar116._44_4_ | (uint)!bVar3 * auVar115._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xc) & 1);
                    auVar129._48_4_ = (uint)bVar3 * auVar116._48_4_ | (uint)!bVar3 * auVar115._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xd) & 1);
                    auVar129._52_4_ = (uint)bVar3 * auVar116._52_4_ | (uint)!bVar3 * auVar115._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xe) & 1);
                    auVar129._56_4_ = (uint)bVar3 * auVar116._56_4_ | (uint)!bVar3 * auVar115._56_4_
                    ;
                    bVar3 = SUB81(uVar80 >> 0xf,0);
                    auVar129._60_4_ = (uint)bVar3 * auVar116._60_4_ | (uint)!bVar3 * auVar115._60_4_
                    ;
                    auVar164 = vpternlogd_avx512f(auVar129,auVar164,auVar100,0xf8);
                    auVar115 = vaddps_avx512f(auVar164,in_ZMM3);
                    bVar3 = (bool)((byte)uVar54 & 1);
                    bVar6 = (bool)((byte)(uVar54 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar54 >> 2) & 1);
                    bVar12 = (bool)((byte)(uVar54 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar54 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar54 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar54 >> 6) & 1);
                    bVar25 = (bool)((byte)(uVar54 >> 7) & 1);
                    bVar28 = (bool)((byte)(uVar54 >> 8) & 1);
                    bVar37 = (bool)((byte)(uVar54 >> 9) & 1);
                    bVar43 = (bool)((byte)(uVar54 >> 10) & 1);
                    bVar29 = (bool)((byte)(uVar54 >> 0xb) & 1);
                    bVar34 = (bool)((byte)(uVar54 >> 0xc) & 1);
                    bVar39 = (bool)((byte)(uVar54 >> 0xd) & 1);
                    bVar44 = (bool)((byte)(uVar54 >> 0xe) & 1);
                    bVar49 = SUB81(uVar54 >> 0xf,0);
                    auVar118 = vpternlogd_avx512f(auVar118,auVar100,auVar113,0xea);
                    uVar80 = vcmpps_avx512f(auVar118,auVar119,1);
                    auVar122 = vpternlogd_avx512f(auVar122,auVar100,auVar114,0xea);
                    bVar4 = (bool)((byte)uVar53 & 1);
                    bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar53 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar53 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar53 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar53 >> 5) & 1);
                    bVar23 = (bool)((byte)(uVar53 >> 6) & 1);
                    bVar26 = (bool)((byte)(uVar53 >> 7) & 1);
                    bVar32 = (bool)((byte)(uVar53 >> 8) & 1);
                    bVar38 = (bool)((byte)(uVar53 >> 9) & 1);
                    bVar47 = (bool)((byte)(uVar53 >> 10) & 1);
                    bVar30 = (bool)((byte)(uVar53 >> 0xb) & 1);
                    bVar35 = (bool)((byte)(uVar53 >> 0xc) & 1);
                    bVar40 = (bool)((byte)(uVar53 >> 0xd) & 1);
                    bVar45 = (bool)((byte)(uVar53 >> 0xe) & 1);
                    bVar50 = SUB81(uVar53 >> 0xf,0);
                    bVar5 = (bool)((byte)uVar52 & 1);
                    bVar8 = (bool)((byte)(uVar52 >> 1) & 1);
                    bVar11 = (bool)((byte)(uVar52 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar52 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar52 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar52 >> 5) & 1);
                    bVar24 = (bool)((byte)(uVar52 >> 6) & 1);
                    bVar27 = (bool)((byte)(uVar52 >> 7) & 1);
                    bVar33 = (bool)((byte)(uVar52 >> 8) & 1);
                    bVar42 = (bool)((byte)(uVar52 >> 9) & 1);
                    bVar48 = (bool)((byte)(uVar52 >> 10) & 1);
                    bVar31 = (bool)((byte)(uVar52 >> 0xb) & 1);
                    bVar36 = (bool)((byte)(uVar52 >> 0xc) & 1);
                    bVar41 = (bool)((byte)(uVar52 >> 0xd) & 1);
                    bVar46 = (bool)((byte)(uVar52 >> 0xe) & 1);
                    bVar51 = SUB81(uVar52 >> 0xf,0);
                    *(uint *)*pauVar97 =
                         (uint)bVar5 *
                         ((uint)bVar4 *
                          ((uint)bVar3 * auVar115._0_4_ | (uint)!bVar3 * auVar164._0_4_) |
                         (uint)!bVar4 * auVar122._0_4_) |
                         (uint)!bVar5 * (uint)((byte)uVar80 & 1) * auVar101._0_4_;
                    *(uint *)((long)*pauVar97 + 4) =
                         (uint)bVar8 *
                         ((uint)bVar7 *
                          ((uint)bVar6 * auVar115._4_4_ | (uint)!bVar6 * auVar164._4_4_) |
                         (uint)!bVar7 * auVar122._4_4_) |
                         (uint)!bVar8 * (uint)((byte)(uVar80 >> 1) & 1) * auVar101._4_4_;
                    *(uint *)((long)*pauVar97 + 8) =
                         (uint)bVar11 *
                         ((uint)bVar10 *
                          ((uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * auVar164._8_4_) |
                         (uint)!bVar10 * auVar122._8_4_) |
                         (uint)!bVar11 * (uint)((byte)(uVar80 >> 2) & 1) * auVar101._8_4_;
                    *(uint *)((long)*pauVar97 + 0xc) =
                         (uint)bVar14 *
                         ((uint)bVar13 *
                          ((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar164._12_4_) |
                         (uint)!bVar13 * auVar122._12_4_) |
                         (uint)!bVar14 * (uint)((byte)(uVar80 >> 3) & 1) * auVar101._12_4_;
                    *(uint *)((long)*pauVar97 + 0x10) =
                         (uint)bVar17 *
                         ((uint)bVar16 *
                          ((uint)bVar15 * auVar115._16_4_ | (uint)!bVar15 * auVar164._16_4_) |
                         (uint)!bVar16 * auVar122._16_4_) |
                         (uint)!bVar17 * (uint)((byte)(uVar80 >> 4) & 1) * auVar101._16_4_;
                    *(uint *)((long)*pauVar97 + 0x14) =
                         (uint)bVar21 *
                         ((uint)bVar19 *
                          ((uint)bVar18 * auVar115._20_4_ | (uint)!bVar18 * auVar164._20_4_) |
                         (uint)!bVar19 * auVar122._20_4_) |
                         (uint)!bVar21 * (uint)((byte)(uVar80 >> 5) & 1) * auVar101._20_4_;
                    *(uint *)((long)*pauVar97 + 0x18) =
                         (uint)bVar24 *
                         ((uint)bVar23 *
                          ((uint)bVar22 * auVar115._24_4_ | (uint)!bVar22 * auVar164._24_4_) |
                         (uint)!bVar23 * auVar122._24_4_) |
                         (uint)!bVar24 * (uint)((byte)(uVar80 >> 6) & 1) * auVar101._24_4_;
                    *(uint *)((long)*pauVar97 + 0x1c) =
                         (uint)bVar27 *
                         ((uint)bVar26 *
                          ((uint)bVar25 * auVar115._28_4_ | (uint)!bVar25 * auVar164._28_4_) |
                         (uint)!bVar26 * auVar122._28_4_) |
                         (uint)!bVar27 * (uint)((byte)(uVar80 >> 7) & 1) * auVar101._28_4_;
                    *(uint *)pauVar97[1] =
                         (uint)bVar33 *
                         ((uint)bVar32 *
                          ((uint)bVar28 * auVar115._32_4_ | (uint)!bVar28 * auVar164._32_4_) |
                         (uint)!bVar32 * auVar122._32_4_) |
                         (uint)!bVar33 * (uint)((byte)(uVar80 >> 8) & 1) * auVar101._32_4_;
                    *(uint *)(pauVar97[1] + 4) =
                         (uint)bVar42 *
                         ((uint)bVar38 *
                          ((uint)bVar37 * auVar115._36_4_ | (uint)!bVar37 * auVar164._36_4_) |
                         (uint)!bVar38 * auVar122._36_4_) |
                         (uint)!bVar42 * (uint)((byte)(uVar80 >> 9) & 1) * auVar101._36_4_;
                    *(uint *)(pauVar97[1] + 8) =
                         (uint)bVar48 *
                         ((uint)bVar47 *
                          ((uint)bVar43 * auVar115._40_4_ | (uint)!bVar43 * auVar164._40_4_) |
                         (uint)!bVar47 * auVar122._40_4_) |
                         (uint)!bVar48 * (uint)((byte)(uVar80 >> 10) & 1) * auVar101._40_4_;
                    *(uint *)(pauVar97[1] + 0xc) =
                         (uint)bVar31 *
                         ((uint)bVar30 *
                          ((uint)bVar29 * auVar115._44_4_ | (uint)!bVar29 * auVar164._44_4_) |
                         (uint)!bVar30 * auVar122._44_4_) |
                         (uint)!bVar31 * (uint)((byte)(uVar80 >> 0xb) & 1) * auVar101._44_4_;
                    *(uint *)(pauVar97[1] + 0x10) =
                         (uint)bVar36 *
                         ((uint)bVar35 *
                          ((uint)bVar34 * auVar115._48_4_ | (uint)!bVar34 * auVar164._48_4_) |
                         (uint)!bVar35 * auVar122._48_4_) |
                         (uint)!bVar36 * (uint)((byte)(uVar80 >> 0xc) & 1) * auVar101._48_4_;
                    *(uint *)(pauVar97[1] + 0x14) =
                         (uint)bVar41 *
                         ((uint)bVar40 *
                          ((uint)bVar39 * auVar115._52_4_ | (uint)!bVar39 * auVar164._52_4_) |
                         (uint)!bVar40 * auVar122._52_4_) |
                         (uint)!bVar41 * (uint)((byte)(uVar80 >> 0xd) & 1) * auVar101._52_4_;
                    *(uint *)(pauVar97[1] + 0x18) =
                         (uint)bVar46 *
                         ((uint)bVar45 *
                          ((uint)bVar44 * auVar115._56_4_ | (uint)!bVar44 * auVar164._56_4_) |
                         (uint)!bVar45 * auVar122._56_4_) |
                         (uint)!bVar46 * (uint)((byte)(uVar80 >> 0xe) & 1) * auVar101._56_4_;
                    *(uint *)(pauVar97[1] + 0x1c) =
                         (uint)bVar51 *
                         ((uint)bVar50 *
                          ((uint)bVar49 * auVar115._60_4_ | (uint)!bVar49 * auVar164._60_4_) |
                         (uint)!bVar50 * auVar122._60_4_) |
                         (uint)!bVar51 * (uint)(byte)(uVar80 >> 0xf) * auVar101._60_4_;
                    pauVar93 = pauVar93 + 1;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pauVar97 = pauVar97 + 2;
                    uVar77 = (int)pMVar79 - 1;
                    pMVar79 = (Mat *)(ulong)uVar77;
                    auVar164 = in_ZMM3;
                  } while (uVar77 != 0);
                }
                if (local_162 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])*pauVar93;
                    afStack_b8 = *(float (*) [2])(*pauVar93 + 8);
                    afStack_b0 = *(float (*) [2])(*pauVar93 + 0x10);
                    afStack_a8 = *(float (*) [2])(*pauVar93 + 0x18);
                    fVar130 = *(float *)ppvVar84;
                    auVar154._4_4_ = fVar130;
                    auVar154._0_4_ = fVar130;
                    auVar154._8_4_ = fVar130;
                    auVar154._12_4_ = fVar130;
                    auVar154._16_4_ = fVar130;
                    auVar154._20_4_ = fVar130;
                    auVar154._24_4_ = fVar130;
                    auVar154._28_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    local_100[4] = fVar130;
                    local_100[5] = fVar130;
                    local_100[6] = fVar130;
                    local_100[7] = fVar130;
                    pMVar79 = (Mat *)BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                                               ((binary_op_atan2 *)&local_164,(__m256 *)local_c0,
                                                (__m256 *)local_100);
                    *pauVar97 = auVar154;
                    pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pauVar97 = pauVar97 + 1;
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                  } while (uVar77 != 0);
                }
                if (local_163 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])*pauVar93;
                    afStack_b8 = *(float (*) [2])(*pauVar93 + 8);
                    fVar130 = *(float *)ppvVar84;
                    auVar143._4_4_ = fVar130;
                    auVar143._0_4_ = fVar130;
                    auVar143._8_4_ = fVar130;
                    auVar143._12_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    auVar155 = ZEXT856(auVar143._8_8_);
                    in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                    afVar165 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                         ((binary_op_atan2 *)&local_164,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar103._0_8_ = afVar165._0_8_;
                    auVar103._8_56_ = auVar155;
                    *(undefined1 (*) [16])*pauVar97 = auVar103._0_16_;
                    pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pauVar97 = (undefined1 (*) [32])((long)*pauVar97 + 0x10);
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                    pMVar79 = extraout_RAX_05;
                  } while (uVar77 != 0);
                }
                if ((char)local_134 == '\0') {
                  lVar90 = 0;
                  lVar92 = 0;
                  do {
                    in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                    fVar130 = atan2f(*(float *)(*pauVar93 + lVar92 * 4),
                                     *(float *)((long)ppvVar84 + lVar92 * 4));
                    *(float *)((long)*pauVar97 + lVar92 * 4) = fVar130;
                    lVar92 = lVar92 + 1;
                    lVar90 = lVar90 + -4;
                  } while ((int)local_160 != (int)lVar92);
                  pauVar97 = (undefined1 (*) [32])((long)pauVar97 - lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar90);
                  pMVar79 = extraout_RAX_06;
                  uVar82 = local_160;
                }
                iVar78 = (int)local_140 + 1;
                auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
                auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
                auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
                auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
                auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
                auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
                auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
                auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
                auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
                auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
                auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
                auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
              } while (iVar78 != (int)local_150);
            }
            local_10c = local_10c + 1;
          } while (local_10c != local_11c);
        }
        in_EAX = (int)pMVar79;
        local_118 = local_118 + 1;
      } while (local_118 != local_108);
    }
    break;
  case 0xb:
    local_160 = (ulong)(uint)a->w;
    local_150 = (ulong)(uint)a->h;
    local_11c = a->d;
    local_108 = (ulong)(uint)a->c;
    local_134 = a->elempack;
    if (0 < a->h && a->dims == 2) {
      bVar3 = a->w < 1;
      local_148 = CONCAT71(local_148._1_7_,local_134 != 0x10 || bVar3);
      local_161 = local_134 != 8 || bVar3;
      local_162 = local_134 != 4 || bVar3;
      local_163 = local_134 != 1 || bVar3;
      uVar82 = 0;
      auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      do {
        auVar164 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar93 = (undefined1 (*) [64])
                   ((long)local_158->w * uVar82 * local_158->elemsize + (long)local_158->data);
        puVar86 = (uint *)local_130->data;
        pauVar95 = (undefined1 (*) [64])
                   ((long)local_128->w * uVar82 * local_128->elemsize + (long)local_128->data);
        uVar80 = local_160;
        auVar119 = in_ZMM5;
        if ((char)local_148 == '\0') {
          do {
            auVar122 = *pauVar93;
            auVar115 = vrcp14ps_avx512f(auVar122);
            auVar116 = vbroadcastss_avx512f(ZEXT416(*puVar86));
            auVar117 = vmulps_avx512f(auVar116,auVar115);
            uVar52 = vcmpps_avx512f(auVar116,auVar164,1);
            auVar118._8_4_ = 0xc0490fdb;
            auVar118._0_8_ = 0xc0490fdbc0490fdb;
            auVar118._12_4_ = 0xc0490fdb;
            auVar118._16_4_ = 0xc0490fdb;
            auVar118._20_4_ = 0xc0490fdb;
            auVar118._24_4_ = 0xc0490fdb;
            auVar118._28_4_ = 0xc0490fdb;
            auVar118._32_4_ = 0xc0490fdb;
            auVar118._36_4_ = 0xc0490fdb;
            auVar118._40_4_ = 0xc0490fdb;
            auVar118._44_4_ = 0xc0490fdb;
            auVar118._48_4_ = 0xc0490fdb;
            auVar118._52_4_ = 0xc0490fdb;
            auVar118._56_4_ = 0xc0490fdb;
            auVar118._60_4_ = 0xc0490fdb;
            auVar118 = vblendmps_avx512f(auVar101,auVar118);
            bVar3 = (bool)((byte)uVar52 & 1);
            in_ZMM5._0_4_ = (uint)bVar3 * auVar118._0_4_ | (uint)!bVar3 * auVar119._0_4_;
            bVar3 = (bool)((byte)(uVar52 >> 1) & 1);
            in_ZMM5._4_4_ = (uint)bVar3 * auVar118._4_4_ | (uint)!bVar3 * auVar119._4_4_;
            bVar3 = (bool)((byte)(uVar52 >> 2) & 1);
            in_ZMM5._8_4_ = (uint)bVar3 * auVar118._8_4_ | (uint)!bVar3 * auVar119._8_4_;
            bVar3 = (bool)((byte)(uVar52 >> 3) & 1);
            in_ZMM5._12_4_ = (uint)bVar3 * auVar118._12_4_ | (uint)!bVar3 * auVar119._12_4_;
            bVar3 = (bool)((byte)(uVar52 >> 4) & 1);
            in_ZMM5._16_4_ = (uint)bVar3 * auVar118._16_4_ | (uint)!bVar3 * auVar119._16_4_;
            bVar3 = (bool)((byte)(uVar52 >> 5) & 1);
            in_ZMM5._20_4_ = (uint)bVar3 * auVar118._20_4_ | (uint)!bVar3 * auVar119._20_4_;
            bVar3 = (bool)((byte)(uVar52 >> 6) & 1);
            in_ZMM5._24_4_ = (uint)bVar3 * auVar118._24_4_ | (uint)!bVar3 * auVar119._24_4_;
            bVar3 = (bool)((byte)(uVar52 >> 7) & 1);
            in_ZMM5._28_4_ = (uint)bVar3 * auVar118._28_4_ | (uint)!bVar3 * auVar119._28_4_;
            bVar3 = (bool)((byte)(uVar52 >> 8) & 1);
            in_ZMM5._32_4_ = (uint)bVar3 * auVar118._32_4_ | (uint)!bVar3 * auVar119._32_4_;
            bVar3 = (bool)((byte)(uVar52 >> 9) & 1);
            in_ZMM5._36_4_ = (uint)bVar3 * auVar118._36_4_ | (uint)!bVar3 * auVar119._36_4_;
            bVar3 = (bool)((byte)(uVar52 >> 10) & 1);
            in_ZMM5._40_4_ = (uint)bVar3 * auVar118._40_4_ | (uint)!bVar3 * auVar119._40_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xb) & 1);
            in_ZMM5._44_4_ = (uint)bVar3 * auVar118._44_4_ | (uint)!bVar3 * auVar119._44_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xc) & 1);
            in_ZMM5._48_4_ = (uint)bVar3 * auVar118._48_4_ | (uint)!bVar3 * auVar119._48_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xd) & 1);
            in_ZMM5._52_4_ = (uint)bVar3 * auVar118._52_4_ | (uint)!bVar3 * auVar119._52_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xe) & 1);
            in_ZMM5._56_4_ = (uint)bVar3 * auVar118._56_4_ | (uint)!bVar3 * auVar119._56_4_;
            bVar3 = SUB81(uVar52 >> 0xf,0);
            in_ZMM5._60_4_ = (uint)bVar3 * auVar118._60_4_ | (uint)!bVar3 * auVar119._60_4_;
            auVar119 = vfmsub213ps_avx512f(auVar117,auVar122,auVar116);
            auVar118 = vfnmadd213ps_avx512f(auVar119,auVar115,auVar117);
            auVar115 = vandps_avx512dq(auVar118,auVar102);
            uVar52 = vcmpps_avx512f(auVar103,auVar115,1);
            auVar117 = vmaxps_avx512f(auVar115,auVar103);
            auVar119._8_4_ = 0xbf800000;
            auVar119._0_8_ = 0xbf800000bf800000;
            auVar119._12_4_ = 0xbf800000;
            auVar119._16_4_ = 0xbf800000;
            auVar119._20_4_ = 0xbf800000;
            auVar119._24_4_ = 0xbf800000;
            auVar119._28_4_ = 0xbf800000;
            auVar119._32_4_ = 0xbf800000;
            auVar119._36_4_ = 0xbf800000;
            auVar119._40_4_ = 0xbf800000;
            auVar119._44_4_ = 0xbf800000;
            auVar119._48_4_ = 0xbf800000;
            auVar119._52_4_ = 0xbf800000;
            auVar119._56_4_ = 0xbf800000;
            auVar119._60_4_ = 0xbf800000;
            auVar119 = vblendmps_avx512f(auVar115,auVar119);
            bVar3 = (bool)((byte)uVar52 & 1);
            auVar120._0_4_ = (uint)bVar3 * auVar119._0_4_ | (uint)!bVar3 * auVar115._0_4_;
            bVar3 = (bool)((byte)(uVar52 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar3 * auVar119._4_4_ | (uint)!bVar3 * auVar115._4_4_;
            bVar3 = (bool)((byte)(uVar52 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar3 * auVar119._8_4_ | (uint)!bVar3 * auVar115._8_4_;
            bVar3 = (bool)((byte)(uVar52 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar3 * auVar119._12_4_ | (uint)!bVar3 * auVar115._12_4_;
            bVar3 = (bool)((byte)(uVar52 >> 4) & 1);
            auVar120._16_4_ = (uint)bVar3 * auVar119._16_4_ | (uint)!bVar3 * auVar115._16_4_;
            bVar3 = (bool)((byte)(uVar52 >> 5) & 1);
            auVar120._20_4_ = (uint)bVar3 * auVar119._20_4_ | (uint)!bVar3 * auVar115._20_4_;
            bVar3 = (bool)((byte)(uVar52 >> 6) & 1);
            auVar120._24_4_ = (uint)bVar3 * auVar119._24_4_ | (uint)!bVar3 * auVar115._24_4_;
            bVar3 = (bool)((byte)(uVar52 >> 7) & 1);
            auVar120._28_4_ = (uint)bVar3 * auVar119._28_4_ | (uint)!bVar3 * auVar115._28_4_;
            bVar20 = (byte)(uVar52 >> 8);
            bVar3 = (bool)(bVar20 & 1);
            auVar120._32_4_ = (uint)bVar3 * auVar119._32_4_ | (uint)!bVar3 * auVar115._32_4_;
            bVar3 = (bool)((byte)(uVar52 >> 9) & 1);
            auVar120._36_4_ = (uint)bVar3 * auVar119._36_4_ | (uint)!bVar3 * auVar115._36_4_;
            bVar3 = (bool)((byte)(uVar52 >> 10) & 1);
            auVar120._40_4_ = (uint)bVar3 * auVar119._40_4_ | (uint)!bVar3 * auVar115._40_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xb) & 1);
            auVar120._44_4_ = (uint)bVar3 * auVar119._44_4_ | (uint)!bVar3 * auVar115._44_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xc) & 1);
            auVar120._48_4_ = (uint)bVar3 * auVar119._48_4_ | (uint)!bVar3 * auVar115._48_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xd) & 1);
            auVar120._52_4_ = (uint)bVar3 * auVar119._52_4_ | (uint)!bVar3 * auVar115._52_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xe) & 1);
            auVar120._56_4_ = (uint)bVar3 * auVar119._56_4_ | (uint)!bVar3 * auVar115._56_4_;
            bVar3 = SUB81(uVar52 >> 0xf,0);
            auVar120._60_4_ = (uint)bVar3 * auVar119._60_4_ | (uint)!bVar3 * auVar115._60_4_;
            auVar119 = vrcp14ps_avx512f(auVar117);
            uVar53 = vcmpps_avx512f(auVar122,auVar164,4);
            auVar115 = vmulps_avx512f(auVar120,auVar119);
            auVar117 = vfmsub213ps_avx512f(auVar117,auVar115,auVar120);
            auVar119 = vfnmadd213ps_avx512f(auVar117,auVar119,auVar115);
            uVar54 = vcmpps_avx512f(auVar122,auVar164,1);
            auVar115 = vmulps_avx512f(auVar119,auVar119);
            auVar117 = vmulps_avx512f(auVar115,auVar115);
            auVar120 = vfmadd213ps_avx512f(auVar104,auVar117,auVar105);
            auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar106);
            auVar121 = vfmadd213ps_avx512f(auVar108,auVar117,auVar109);
            auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar107);
            auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar110);
            auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar111);
            auVar117 = vfmadd213ps_avx512f(auVar121,auVar117,auVar103);
            uVar55 = vcmpps_avx512f(auVar116,auVar164,4);
            auVar115 = vfmadd231ps_avx512f(auVar117,auVar115,auVar120);
            auVar119 = vmulps_avx512f(auVar115,auVar119);
            auVar115 = vaddps_avx512f(auVar119,auVar112);
            bVar3 = (bool)((byte)uVar52 & 1);
            auVar117._0_4_ = (uint)bVar3 * auVar115._0_4_ | (uint)!bVar3 * auVar119._0_4_;
            bVar3 = (bool)((byte)(uVar52 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar3 * auVar115._4_4_ | (uint)!bVar3 * auVar119._4_4_;
            bVar3 = (bool)((byte)(uVar52 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar3 * auVar115._8_4_ | (uint)!bVar3 * auVar119._8_4_;
            bVar3 = (bool)((byte)(uVar52 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar3 * auVar115._12_4_ | (uint)!bVar3 * auVar119._12_4_;
            bVar3 = (bool)((byte)(uVar52 >> 4) & 1);
            auVar117._16_4_ = (uint)bVar3 * auVar115._16_4_ | (uint)!bVar3 * auVar119._16_4_;
            bVar3 = (bool)((byte)(uVar52 >> 5) & 1);
            auVar117._20_4_ = (uint)bVar3 * auVar115._20_4_ | (uint)!bVar3 * auVar119._20_4_;
            bVar3 = (bool)((byte)(uVar52 >> 6) & 1);
            auVar117._24_4_ = (uint)bVar3 * auVar115._24_4_ | (uint)!bVar3 * auVar119._24_4_;
            bVar3 = (bool)((byte)(uVar52 >> 7) & 1);
            auVar117._28_4_ = (uint)bVar3 * auVar115._28_4_ | (uint)!bVar3 * auVar119._28_4_;
            bVar3 = (bool)(bVar20 & 1);
            auVar117._32_4_ = (uint)bVar3 * auVar115._32_4_ | (uint)!bVar3 * auVar119._32_4_;
            bVar3 = (bool)((byte)(uVar52 >> 9) & 1);
            auVar117._36_4_ = (uint)bVar3 * auVar115._36_4_ | (uint)!bVar3 * auVar119._36_4_;
            bVar3 = (bool)((byte)(uVar52 >> 10) & 1);
            auVar117._40_4_ = (uint)bVar3 * auVar115._40_4_ | (uint)!bVar3 * auVar119._40_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xb) & 1);
            auVar117._44_4_ = (uint)bVar3 * auVar115._44_4_ | (uint)!bVar3 * auVar119._44_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xc) & 1);
            auVar117._48_4_ = (uint)bVar3 * auVar115._48_4_ | (uint)!bVar3 * auVar119._48_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xd) & 1);
            auVar117._52_4_ = (uint)bVar3 * auVar115._52_4_ | (uint)!bVar3 * auVar119._52_4_;
            bVar3 = (bool)((byte)(uVar52 >> 0xe) & 1);
            auVar117._56_4_ = (uint)bVar3 * auVar115._56_4_ | (uint)!bVar3 * auVar119._56_4_;
            bVar3 = SUB81(uVar52 >> 0xf,0);
            auVar117._60_4_ = (uint)bVar3 * auVar115._60_4_ | (uint)!bVar3 * auVar119._60_4_;
            auVar119 = vpternlogd_avx512f(auVar117,auVar118,auVar100,0xf8);
            auVar118 = vaddps_avx512f(auVar119,in_ZMM5);
            bVar3 = (bool)((byte)uVar54 & 1);
            bVar6 = (bool)((byte)(uVar54 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar54 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar54 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar54 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar54 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar54 >> 6) & 1);
            bVar18 = (bool)((byte)(uVar54 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar54 >> 8) & 1);
            bVar23 = (bool)((byte)(uVar54 >> 9) & 1);
            bVar25 = (bool)((byte)(uVar54 >> 10) & 1);
            bVar27 = (bool)((byte)(uVar54 >> 0xb) & 1);
            bVar32 = (bool)((byte)(uVar54 >> 0xc) & 1);
            bVar37 = (bool)((byte)(uVar54 >> 0xd) & 1);
            bVar42 = (bool)((byte)(uVar54 >> 0xe) & 1);
            bVar47 = SUB81(uVar54 >> 0xf,0);
            auVar122 = vpternlogd_avx512f(auVar122,auVar100,auVar113,0xea);
            uVar52 = vcmpps_avx512f(auVar122,auVar164,1);
            auVar122 = vpternlogd_avx512f(auVar116,auVar100,auVar114,0xea);
            bVar4 = (bool)((byte)uVar53 & 1);
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar53 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar53 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar53 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar53 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar53 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar53 >> 7) & 1);
            bVar22 = (bool)((byte)(uVar53 >> 8) & 1);
            bVar24 = (bool)((byte)(uVar53 >> 9) & 1);
            bVar26 = (bool)((byte)(uVar53 >> 10) & 1);
            bVar28 = (bool)((byte)(uVar53 >> 0xb) & 1);
            bVar33 = (bool)((byte)(uVar53 >> 0xc) & 1);
            bVar38 = (bool)((byte)(uVar53 >> 0xd) & 1);
            bVar43 = (bool)((byte)(uVar53 >> 0xe) & 1);
            bVar48 = SUB81(uVar53 >> 0xf,0);
            bVar5 = (bool)((byte)uVar55 & 1);
            auVar115._0_4_ =
                 (uint)bVar5 *
                 ((uint)bVar4 * ((uint)bVar3 * auVar118._0_4_ | (uint)!bVar3 * auVar119._0_4_) |
                 (uint)!bVar4 * auVar122._0_4_) |
                 (uint)!bVar5 * (uint)((byte)uVar52 & 1) * auVar101._0_4_;
            bVar3 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar115._4_4_ =
                 (uint)bVar3 *
                 ((uint)bVar7 * ((uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar119._4_4_) |
                 (uint)!bVar7 * auVar122._4_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 1) & 1) * auVar101._4_4_;
            bVar3 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar115._8_4_ =
                 (uint)bVar3 *
                 ((uint)bVar9 * ((uint)bVar8 * auVar118._8_4_ | (uint)!bVar8 * auVar119._8_4_) |
                 (uint)!bVar9 * auVar122._8_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 2) & 1) * auVar101._8_4_;
            bVar3 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar115._12_4_ =
                 (uint)bVar3 *
                 ((uint)bVar11 * ((uint)bVar10 * auVar118._12_4_ | (uint)!bVar10 * auVar119._12_4_)
                 | (uint)!bVar11 * auVar122._12_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 3) & 1) * auVar101._12_4_;
            bVar3 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar115._16_4_ =
                 (uint)bVar3 *
                 ((uint)bVar13 * ((uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * auVar119._16_4_)
                 | (uint)!bVar13 * auVar122._16_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 4) & 1) * auVar101._16_4_;
            bVar3 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar115._20_4_ =
                 (uint)bVar3 *
                 ((uint)bVar15 * ((uint)bVar14 * auVar118._20_4_ | (uint)!bVar14 * auVar119._20_4_)
                 | (uint)!bVar15 * auVar122._20_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 5) & 1) * auVar101._20_4_;
            bVar3 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar115._24_4_ =
                 (uint)bVar3 *
                 ((uint)bVar17 * ((uint)bVar16 * auVar118._24_4_ | (uint)!bVar16 * auVar119._24_4_)
                 | (uint)!bVar17 * auVar122._24_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 6) & 1) * auVar101._24_4_;
            bVar3 = (bool)((byte)(uVar55 >> 7) & 1);
            auVar115._28_4_ =
                 (uint)bVar3 *
                 ((uint)bVar19 * ((uint)bVar18 * auVar118._28_4_ | (uint)!bVar18 * auVar119._28_4_)
                 | (uint)!bVar19 * auVar122._28_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 7) & 1) * auVar101._28_4_;
            bVar3 = (bool)((byte)(uVar55 >> 8) & 1);
            auVar115._32_4_ =
                 (uint)bVar3 *
                 ((uint)bVar22 * ((uint)bVar21 * auVar118._32_4_ | (uint)!bVar21 * auVar119._32_4_)
                 | (uint)!bVar22 * auVar122._32_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 8) & 1) * auVar101._32_4_;
            bVar3 = (bool)((byte)(uVar55 >> 9) & 1);
            auVar115._36_4_ =
                 (uint)bVar3 *
                 ((uint)bVar24 * ((uint)bVar23 * auVar118._36_4_ | (uint)!bVar23 * auVar119._36_4_)
                 | (uint)!bVar24 * auVar122._36_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 9) & 1) * auVar101._36_4_;
            bVar3 = (bool)((byte)(uVar55 >> 10) & 1);
            auVar115._40_4_ =
                 (uint)bVar3 *
                 ((uint)bVar26 * ((uint)bVar25 * auVar118._40_4_ | (uint)!bVar25 * auVar119._40_4_)
                 | (uint)!bVar26 * auVar122._40_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 10) & 1) * auVar101._40_4_;
            bVar3 = (bool)((byte)(uVar55 >> 0xb) & 1);
            auVar115._44_4_ =
                 (uint)bVar3 *
                 ((uint)bVar28 * ((uint)bVar27 * auVar118._44_4_ | (uint)!bVar27 * auVar119._44_4_)
                 | (uint)!bVar28 * auVar122._44_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 0xb) & 1) * auVar101._44_4_;
            bVar3 = (bool)((byte)(uVar55 >> 0xc) & 1);
            auVar115._48_4_ =
                 (uint)bVar3 *
                 ((uint)bVar33 * ((uint)bVar32 * auVar118._48_4_ | (uint)!bVar32 * auVar119._48_4_)
                 | (uint)!bVar33 * auVar122._48_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 0xc) & 1) * auVar101._48_4_;
            bVar3 = (bool)((byte)(uVar55 >> 0xd) & 1);
            auVar115._52_4_ =
                 (uint)bVar3 *
                 ((uint)bVar38 * ((uint)bVar37 * auVar118._52_4_ | (uint)!bVar37 * auVar119._52_4_)
                 | (uint)!bVar38 * auVar122._52_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 0xd) & 1) * auVar101._52_4_;
            bVar3 = (bool)((byte)(uVar55 >> 0xe) & 1);
            auVar115._56_4_ =
                 (uint)bVar3 *
                 ((uint)bVar43 * ((uint)bVar42 * auVar118._56_4_ | (uint)!bVar42 * auVar119._56_4_)
                 | (uint)!bVar43 * auVar122._56_4_) |
                 (uint)!bVar3 * (uint)((byte)(uVar52 >> 0xe) & 1) * auVar101._56_4_;
            bVar3 = SUB81(uVar55 >> 0xf,0);
            auVar115._60_4_ =
                 (uint)bVar3 *
                 ((uint)bVar48 * ((uint)bVar47 * auVar118._60_4_ | (uint)!bVar47 * auVar119._60_4_)
                 | (uint)!bVar48 * auVar122._60_4_) |
                 (uint)!bVar3 * (uint)(byte)(uVar52 >> 0xf) * auVar101._60_4_;
            *pauVar95 = auVar115;
            pauVar93 = pauVar93 + 1;
            puVar86 = puVar86 + 1;
            pauVar95 = pauVar95 + 1;
            uVar77 = (int)uVar80 - 1;
            uVar80 = (ulong)uVar77;
            auVar119 = in_ZMM5;
          } while (uVar77 != 0);
        }
        local_140 = uVar82;
        if (local_161 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])*pauVar93;
            afStack_b8 = *(float (*) [2])(*pauVar93 + 8);
            afStack_b0 = *(float (*) [2])(*pauVar93 + 0x10);
            afStack_a8 = *(float (*) [2])(*pauVar93 + 0x18);
            uVar77 = *puVar86;
            auVar99._4_4_ = uVar77;
            auVar99._0_4_ = uVar77;
            auVar99._8_4_ = uVar77;
            auVar99._12_4_ = uVar77;
            auVar99._16_4_ = uVar77;
            auVar99._20_4_ = uVar77;
            auVar99._24_4_ = uVar77;
            auVar99._28_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            local_100[4] = (float)uVar77;
            local_100[5] = (float)uVar77;
            local_100[6] = (float)uVar77;
            local_100[7] = (float)uVar77;
            BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                      (&local_164,(__m256 *)local_c0,(__m256 *)local_100);
            *(undefined1 (*) [32])*pauVar95 = auVar99;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x20);
            puVar86 = puVar86 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x20);
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        if (local_162 == '\0') {
          uVar82 = local_160 & 0xffffffff;
          do {
            local_c0 = *(float (*) [2])*pauVar93;
            afStack_b8 = *(float (*) [2])(*pauVar93 + 8);
            uVar77 = *puVar86;
            auVar98._4_4_ = uVar77;
            auVar98._0_4_ = uVar77;
            auVar98._8_4_ = uVar77;
            auVar98._12_4_ = uVar77;
            local_100[0] = (float)uVar77;
            local_100[1] = (float)uVar77;
            local_100[2] = (float)uVar77;
            local_100[3] = (float)uVar77;
            auVar155 = ZEXT856(auVar98._8_8_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            afVar165 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                 (&local_164,(__m128 *)local_c0,(__m128 *)local_100);
            auVar100._0_8_ = afVar165._0_8_;
            auVar100._8_56_ = auVar155;
            *(undefined1 (*) [16])*pauVar95 = auVar100._0_16_;
            pauVar93 = (undefined1 (*) [64])(*pauVar93 + 0x10);
            puVar86 = puVar86 + 1;
            pauVar95 = (undefined1 (*) [64])((long)*pauVar95 + 0x10);
            uVar77 = (int)uVar82 - 1;
            uVar82 = (ulong)uVar77;
          } while (uVar77 != 0);
        }
        uVar82 = local_160;
        if (local_163 == '\0') {
          lVar90 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar130 = atan2f((float)puVar86[lVar90],*(float *)(*pauVar93 + lVar90 * 4));
            *(float *)((long)*pauVar95 + lVar90 * 4) = fVar130;
            lVar90 = lVar90 + 1;
          } while ((int)uVar82 != (int)lVar90);
        }
        uVar82 = local_140 + 1;
        auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      } while (uVar82 != local_150);
    }
    uVar77 = local_158->dims - 3;
    uVar72 = (undefined3)(uVar77 >> 8);
    in_EAX = CONCAT31(uVar72,uVar77 < 2);
    if (0 < (int)local_108 && uVar77 < 2) {
      bVar3 = (int)local_160 < 1;
      pMVar79 = (Mat *)(ulong)CONCAT31(uVar72,bVar3);
      local_161 = local_134 != 0x10 || bVar3;
      local_162 = local_134 != 8 || bVar3;
      local_163 = local_134 != 4 || bVar3;
      local_134 = CONCAT31(local_134._1_3_,local_134 != 1 || bVar3);
      local_118 = 0;
      auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      uVar82 = local_160;
      do {
        if (0 < local_11c) {
          pauVar93 = (undefined1 (*) [64])
                     (local_128->cstep * local_118 * local_128->elemsize + (long)local_128->data);
          pauVar95 = (undefined1 (*) [64])
                     (local_158->cstep * local_118 * local_158->elemsize + (long)local_158->data);
          local_10c = 0;
          pMVar79 = local_158;
          do {
            if (0 < (int)local_150) {
              iVar78 = local_130->d + -1;
              if (local_10c <= iVar78) {
                iVar78 = local_10c;
              }
              local_148 = (long)iVar78;
              iVar78 = 0;
              do {
                iVar81 = local_130->h + -1;
                local_140 = CONCAT44(local_140._4_4_,iVar78);
                if (iVar78 <= iVar81) {
                  iVar81 = iVar78;
                }
                lVar90 = (long)local_130->w * local_130->elemsize;
                pMVar79 = (Mat *)(local_130->h * local_148 * lVar90 + (long)local_130->data);
                ppvVar84 = (void **)((long)&pMVar79->data + iVar81 * lVar90);
                if (local_161 == '\0') {
                  pMVar79 = (Mat *)(uVar82 & 0xffffffff);
                  auVar164 = in_ZMM5;
                  do {
                    auVar122 = *pauVar95;
                    auVar118 = vrcp14ps_avx512f(auVar122);
                    auVar115 = vbroadcastss_avx512f(ZEXT416((uint)*(float *)ppvVar84));
                    auVar117 = vmulps_avx512f(auVar115,auVar118);
                    uVar80 = vcmpps_avx512f(auVar115,auVar119,1);
                    auVar116._8_4_ = 0xc0490fdb;
                    auVar116._0_8_ = 0xc0490fdbc0490fdb;
                    auVar116._12_4_ = 0xc0490fdb;
                    auVar116._16_4_ = 0xc0490fdb;
                    auVar116._20_4_ = 0xc0490fdb;
                    auVar116._24_4_ = 0xc0490fdb;
                    auVar116._28_4_ = 0xc0490fdb;
                    auVar116._32_4_ = 0xc0490fdb;
                    auVar116._36_4_ = 0xc0490fdb;
                    auVar116._40_4_ = 0xc0490fdb;
                    auVar116._44_4_ = 0xc0490fdb;
                    auVar116._48_4_ = 0xc0490fdb;
                    auVar116._52_4_ = 0xc0490fdb;
                    auVar116._56_4_ = 0xc0490fdb;
                    auVar116._60_4_ = 0xc0490fdb;
                    auVar116 = vblendmps_avx512f(auVar101,auVar116);
                    bVar3 = (bool)((byte)uVar80 & 1);
                    in_ZMM5._0_4_ = (uint)bVar3 * auVar116._0_4_ | (uint)!bVar3 * auVar164._0_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 1) & 1);
                    in_ZMM5._4_4_ = (uint)bVar3 * auVar116._4_4_ | (uint)!bVar3 * auVar164._4_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 2) & 1);
                    in_ZMM5._8_4_ = (uint)bVar3 * auVar116._8_4_ | (uint)!bVar3 * auVar164._8_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 3) & 1);
                    in_ZMM5._12_4_ = (uint)bVar3 * auVar116._12_4_ | (uint)!bVar3 * auVar164._12_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 4) & 1);
                    in_ZMM5._16_4_ = (uint)bVar3 * auVar116._16_4_ | (uint)!bVar3 * auVar164._16_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 5) & 1);
                    in_ZMM5._20_4_ = (uint)bVar3 * auVar116._20_4_ | (uint)!bVar3 * auVar164._20_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 6) & 1);
                    in_ZMM5._24_4_ = (uint)bVar3 * auVar116._24_4_ | (uint)!bVar3 * auVar164._24_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 7) & 1);
                    in_ZMM5._28_4_ = (uint)bVar3 * auVar116._28_4_ | (uint)!bVar3 * auVar164._28_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 8) & 1);
                    in_ZMM5._32_4_ = (uint)bVar3 * auVar116._32_4_ | (uint)!bVar3 * auVar164._32_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 9) & 1);
                    in_ZMM5._36_4_ = (uint)bVar3 * auVar116._36_4_ | (uint)!bVar3 * auVar164._36_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 10) & 1);
                    in_ZMM5._40_4_ = (uint)bVar3 * auVar116._40_4_ | (uint)!bVar3 * auVar164._40_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xb) & 1);
                    in_ZMM5._44_4_ = (uint)bVar3 * auVar116._44_4_ | (uint)!bVar3 * auVar164._44_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xc) & 1);
                    in_ZMM5._48_4_ = (uint)bVar3 * auVar116._48_4_ | (uint)!bVar3 * auVar164._48_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xd) & 1);
                    in_ZMM5._52_4_ = (uint)bVar3 * auVar116._52_4_ | (uint)!bVar3 * auVar164._52_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 0xe) & 1);
                    in_ZMM5._56_4_ = (uint)bVar3 * auVar116._56_4_ | (uint)!bVar3 * auVar164._56_4_;
                    bVar3 = SUB81(uVar80 >> 0xf,0);
                    in_ZMM5._60_4_ = (uint)bVar3 * auVar116._60_4_ | (uint)!bVar3 * auVar164._60_4_;
                    auVar164 = vfmsub213ps_avx512f(auVar117,auVar122,auVar115);
                    auVar118 = vfnmadd213ps_avx512f(auVar164,auVar118,auVar117);
                    auVar116 = vandps_avx512dq(auVar118,auVar102);
                    uVar80 = vcmpps_avx512f(auVar103,auVar116,1);
                    auVar117 = vmaxps_avx512f(auVar116,auVar103);
                    auVar164._8_4_ = 0xbf800000;
                    auVar164._0_8_ = 0xbf800000bf800000;
                    auVar164._12_4_ = 0xbf800000;
                    auVar164._16_4_ = 0xbf800000;
                    auVar164._20_4_ = 0xbf800000;
                    auVar164._24_4_ = 0xbf800000;
                    auVar164._28_4_ = 0xbf800000;
                    auVar164._32_4_ = 0xbf800000;
                    auVar164._36_4_ = 0xbf800000;
                    auVar164._40_4_ = 0xbf800000;
                    auVar164._44_4_ = 0xbf800000;
                    auVar164._48_4_ = 0xbf800000;
                    auVar164._52_4_ = 0xbf800000;
                    auVar164._56_4_ = 0xbf800000;
                    auVar164._60_4_ = 0xbf800000;
                    auVar164 = vblendmps_avx512f(auVar116,auVar164);
                    bVar3 = (bool)((byte)uVar80 & 1);
                    auVar121._0_4_ = (uint)bVar3 * auVar164._0_4_ | (uint)!bVar3 * auVar116._0_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar121._4_4_ = (uint)bVar3 * auVar164._4_4_ | (uint)!bVar3 * auVar116._4_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar121._8_4_ = (uint)bVar3 * auVar164._8_4_ | (uint)!bVar3 * auVar116._8_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 3) & 1);
                    auVar121._12_4_ = (uint)bVar3 * auVar164._12_4_ | (uint)!bVar3 * auVar116._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 4) & 1);
                    auVar121._16_4_ = (uint)bVar3 * auVar164._16_4_ | (uint)!bVar3 * auVar116._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 5) & 1);
                    auVar121._20_4_ = (uint)bVar3 * auVar164._20_4_ | (uint)!bVar3 * auVar116._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 6) & 1);
                    auVar121._24_4_ = (uint)bVar3 * auVar164._24_4_ | (uint)!bVar3 * auVar116._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 7) & 1);
                    auVar121._28_4_ = (uint)bVar3 * auVar164._28_4_ | (uint)!bVar3 * auVar116._28_4_
                    ;
                    bVar20 = (byte)(uVar80 >> 8);
                    bVar3 = (bool)(bVar20 & 1);
                    auVar121._32_4_ = (uint)bVar3 * auVar164._32_4_ | (uint)!bVar3 * auVar116._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 9) & 1);
                    auVar121._36_4_ = (uint)bVar3 * auVar164._36_4_ | (uint)!bVar3 * auVar116._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 10) & 1);
                    auVar121._40_4_ = (uint)bVar3 * auVar164._40_4_ | (uint)!bVar3 * auVar116._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xb) & 1);
                    auVar121._44_4_ = (uint)bVar3 * auVar164._44_4_ | (uint)!bVar3 * auVar116._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xc) & 1);
                    auVar121._48_4_ = (uint)bVar3 * auVar164._48_4_ | (uint)!bVar3 * auVar116._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xd) & 1);
                    auVar121._52_4_ = (uint)bVar3 * auVar164._52_4_ | (uint)!bVar3 * auVar116._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xe) & 1);
                    auVar121._56_4_ = (uint)bVar3 * auVar164._56_4_ | (uint)!bVar3 * auVar116._56_4_
                    ;
                    bVar3 = SUB81(uVar80 >> 0xf,0);
                    auVar121._60_4_ = (uint)bVar3 * auVar164._60_4_ | (uint)!bVar3 * auVar116._60_4_
                    ;
                    auVar164 = vrcp14ps_avx512f(auVar117);
                    uVar52 = vcmpps_avx512f(auVar122,auVar119,4);
                    auVar116 = vmulps_avx512f(auVar121,auVar164);
                    auVar117 = vfmsub213ps_avx512f(auVar117,auVar116,auVar121);
                    auVar164 = vfnmadd213ps_avx512f(auVar117,auVar164,auVar116);
                    uVar53 = vcmpps_avx512f(auVar122,auVar119,1);
                    auVar116 = vmulps_avx512f(auVar164,auVar164);
                    auVar117 = vmulps_avx512f(auVar116,auVar116);
                    auVar120 = vfmadd213ps_avx512f(auVar104,auVar117,auVar105);
                    auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar106);
                    auVar121 = vfmadd213ps_avx512f(auVar108,auVar117,auVar109);
                    auVar120 = vfmadd213ps_avx512f(auVar120,auVar117,auVar107);
                    auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar110);
                    auVar121 = vfmadd213ps_avx512f(auVar121,auVar117,auVar111);
                    auVar117 = vfmadd213ps_avx512f(auVar121,auVar117,auVar103);
                    uVar54 = vcmpps_avx512f(auVar115,auVar119,4);
                    auVar116 = vfmadd231ps_avx512f(auVar117,auVar116,auVar120);
                    auVar164 = vmulps_avx512f(auVar116,auVar164);
                    auVar116 = vaddps_avx512f(auVar164,auVar112);
                    bVar3 = (bool)((byte)uVar80 & 1);
                    auVar123._0_4_ = (uint)bVar3 * auVar116._0_4_ | (uint)!bVar3 * auVar164._0_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar123._4_4_ = (uint)bVar3 * auVar116._4_4_ | (uint)!bVar3 * auVar164._4_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar123._8_4_ = (uint)bVar3 * auVar116._8_4_ | (uint)!bVar3 * auVar164._8_4_;
                    bVar3 = (bool)((byte)(uVar80 >> 3) & 1);
                    auVar123._12_4_ = (uint)bVar3 * auVar116._12_4_ | (uint)!bVar3 * auVar164._12_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 4) & 1);
                    auVar123._16_4_ = (uint)bVar3 * auVar116._16_4_ | (uint)!bVar3 * auVar164._16_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 5) & 1);
                    auVar123._20_4_ = (uint)bVar3 * auVar116._20_4_ | (uint)!bVar3 * auVar164._20_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 6) & 1);
                    auVar123._24_4_ = (uint)bVar3 * auVar116._24_4_ | (uint)!bVar3 * auVar164._24_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 7) & 1);
                    auVar123._28_4_ = (uint)bVar3 * auVar116._28_4_ | (uint)!bVar3 * auVar164._28_4_
                    ;
                    bVar3 = (bool)(bVar20 & 1);
                    auVar123._32_4_ = (uint)bVar3 * auVar116._32_4_ | (uint)!bVar3 * auVar164._32_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 9) & 1);
                    auVar123._36_4_ = (uint)bVar3 * auVar116._36_4_ | (uint)!bVar3 * auVar164._36_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 10) & 1);
                    auVar123._40_4_ = (uint)bVar3 * auVar116._40_4_ | (uint)!bVar3 * auVar164._40_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xb) & 1);
                    auVar123._44_4_ = (uint)bVar3 * auVar116._44_4_ | (uint)!bVar3 * auVar164._44_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xc) & 1);
                    auVar123._48_4_ = (uint)bVar3 * auVar116._48_4_ | (uint)!bVar3 * auVar164._48_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xd) & 1);
                    auVar123._52_4_ = (uint)bVar3 * auVar116._52_4_ | (uint)!bVar3 * auVar164._52_4_
                    ;
                    bVar3 = (bool)((byte)(uVar80 >> 0xe) & 1);
                    auVar123._56_4_ = (uint)bVar3 * auVar116._56_4_ | (uint)!bVar3 * auVar164._56_4_
                    ;
                    bVar3 = SUB81(uVar80 >> 0xf,0);
                    auVar123._60_4_ = (uint)bVar3 * auVar116._60_4_ | (uint)!bVar3 * auVar164._60_4_
                    ;
                    auVar164 = vpternlogd_avx512f(auVar123,auVar118,auVar100,0xf8);
                    auVar118 = vaddps_avx512f(auVar164,in_ZMM5);
                    bVar3 = (bool)((byte)uVar53 & 1);
                    bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
                    bVar10 = (bool)((byte)(uVar53 >> 3) & 1);
                    bVar12 = (bool)((byte)(uVar53 >> 4) & 1);
                    bVar14 = (bool)((byte)(uVar53 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar53 >> 6) & 1);
                    bVar18 = (bool)((byte)(uVar53 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar53 >> 8) & 1);
                    bVar23 = (bool)((byte)(uVar53 >> 9) & 1);
                    bVar25 = (bool)((byte)(uVar53 >> 10) & 1);
                    bVar27 = (bool)((byte)(uVar53 >> 0xb) & 1);
                    bVar32 = (bool)((byte)(uVar53 >> 0xc) & 1);
                    bVar37 = (bool)((byte)(uVar53 >> 0xd) & 1);
                    bVar42 = (bool)((byte)(uVar53 >> 0xe) & 1);
                    bVar47 = SUB81(uVar53 >> 0xf,0);
                    auVar122 = vpternlogd_avx512f(auVar122,auVar100,auVar113,0xea);
                    uVar80 = vcmpps_avx512f(auVar122,auVar119,1);
                    auVar122 = vpternlogd_avx512f(auVar115,auVar100,auVar114,0xea);
                    bVar4 = (bool)((byte)uVar52 & 1);
                    bVar7 = (bool)((byte)(uVar52 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar52 >> 2) & 1);
                    bVar11 = (bool)((byte)(uVar52 >> 3) & 1);
                    bVar13 = (bool)((byte)(uVar52 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar52 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar52 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar52 >> 7) & 1);
                    bVar22 = (bool)((byte)(uVar52 >> 8) & 1);
                    bVar24 = (bool)((byte)(uVar52 >> 9) & 1);
                    bVar26 = (bool)((byte)(uVar52 >> 10) & 1);
                    bVar28 = (bool)((byte)(uVar52 >> 0xb) & 1);
                    bVar33 = (bool)((byte)(uVar52 >> 0xc) & 1);
                    bVar38 = (bool)((byte)(uVar52 >> 0xd) & 1);
                    bVar43 = (bool)((byte)(uVar52 >> 0xe) & 1);
                    bVar48 = SUB81(uVar52 >> 0xf,0);
                    bVar5 = (bool)((byte)uVar54 & 1);
                    auVar124._0_4_ =
                         (uint)bVar5 *
                         ((uint)bVar4 *
                          ((uint)bVar3 * auVar118._0_4_ | (uint)!bVar3 * auVar164._0_4_) |
                         (uint)!bVar4 * auVar122._0_4_) |
                         (uint)!bVar5 * (uint)((byte)uVar80 & 1) * auVar101._0_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 1) & 1);
                    auVar124._4_4_ =
                         (uint)bVar3 *
                         ((uint)bVar7 *
                          ((uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar164._4_4_) |
                         (uint)!bVar7 * auVar122._4_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 1) & 1) * auVar101._4_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 2) & 1);
                    auVar124._8_4_ =
                         (uint)bVar3 *
                         ((uint)bVar9 *
                          ((uint)bVar8 * auVar118._8_4_ | (uint)!bVar8 * auVar164._8_4_) |
                         (uint)!bVar9 * auVar122._8_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 2) & 1) * auVar101._8_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 3) & 1);
                    auVar124._12_4_ =
                         (uint)bVar3 *
                         ((uint)bVar11 *
                          ((uint)bVar10 * auVar118._12_4_ | (uint)!bVar10 * auVar164._12_4_) |
                         (uint)!bVar11 * auVar122._12_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 3) & 1) * auVar101._12_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 4) & 1);
                    auVar124._16_4_ =
                         (uint)bVar3 *
                         ((uint)bVar13 *
                          ((uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * auVar164._16_4_) |
                         (uint)!bVar13 * auVar122._16_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 4) & 1) * auVar101._16_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 5) & 1);
                    auVar124._20_4_ =
                         (uint)bVar3 *
                         ((uint)bVar15 *
                          ((uint)bVar14 * auVar118._20_4_ | (uint)!bVar14 * auVar164._20_4_) |
                         (uint)!bVar15 * auVar122._20_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 5) & 1) * auVar101._20_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 6) & 1);
                    auVar124._24_4_ =
                         (uint)bVar3 *
                         ((uint)bVar17 *
                          ((uint)bVar16 * auVar118._24_4_ | (uint)!bVar16 * auVar164._24_4_) |
                         (uint)!bVar17 * auVar122._24_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 6) & 1) * auVar101._24_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 7) & 1);
                    auVar124._28_4_ =
                         (uint)bVar3 *
                         ((uint)bVar19 *
                          ((uint)bVar18 * auVar118._28_4_ | (uint)!bVar18 * auVar164._28_4_) |
                         (uint)!bVar19 * auVar122._28_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 7) & 1) * auVar101._28_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 8) & 1);
                    auVar124._32_4_ =
                         (uint)bVar3 *
                         ((uint)bVar22 *
                          ((uint)bVar21 * auVar118._32_4_ | (uint)!bVar21 * auVar164._32_4_) |
                         (uint)!bVar22 * auVar122._32_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 8) & 1) * auVar101._32_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 9) & 1);
                    auVar124._36_4_ =
                         (uint)bVar3 *
                         ((uint)bVar24 *
                          ((uint)bVar23 * auVar118._36_4_ | (uint)!bVar23 * auVar164._36_4_) |
                         (uint)!bVar24 * auVar122._36_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 9) & 1) * auVar101._36_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 10) & 1);
                    auVar124._40_4_ =
                         (uint)bVar3 *
                         ((uint)bVar26 *
                          ((uint)bVar25 * auVar118._40_4_ | (uint)!bVar25 * auVar164._40_4_) |
                         (uint)!bVar26 * auVar122._40_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 10) & 1) * auVar101._40_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 0xb) & 1);
                    auVar124._44_4_ =
                         (uint)bVar3 *
                         ((uint)bVar28 *
                          ((uint)bVar27 * auVar118._44_4_ | (uint)!bVar27 * auVar164._44_4_) |
                         (uint)!bVar28 * auVar122._44_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 0xb) & 1) * auVar101._44_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 0xc) & 1);
                    auVar124._48_4_ =
                         (uint)bVar3 *
                         ((uint)bVar33 *
                          ((uint)bVar32 * auVar118._48_4_ | (uint)!bVar32 * auVar164._48_4_) |
                         (uint)!bVar33 * auVar122._48_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 0xc) & 1) * auVar101._48_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 0xd) & 1);
                    auVar124._52_4_ =
                         (uint)bVar3 *
                         ((uint)bVar38 *
                          ((uint)bVar37 * auVar118._52_4_ | (uint)!bVar37 * auVar164._52_4_) |
                         (uint)!bVar38 * auVar122._52_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 0xd) & 1) * auVar101._52_4_;
                    bVar3 = (bool)((byte)(uVar54 >> 0xe) & 1);
                    auVar124._56_4_ =
                         (uint)bVar3 *
                         ((uint)bVar43 *
                          ((uint)bVar42 * auVar118._56_4_ | (uint)!bVar42 * auVar164._56_4_) |
                         (uint)!bVar43 * auVar122._56_4_) |
                         (uint)!bVar3 * (uint)((byte)(uVar80 >> 0xe) & 1) * auVar101._56_4_;
                    bVar3 = SUB81(uVar54 >> 0xf,0);
                    auVar124._60_4_ =
                         (uint)bVar3 *
                         ((uint)bVar48 *
                          ((uint)bVar47 * auVar118._60_4_ | (uint)!bVar47 * auVar164._60_4_) |
                         (uint)!bVar48 * auVar122._60_4_) |
                         (uint)!bVar3 * (uint)(byte)(uVar80 >> 0xf) * auVar101._60_4_;
                    *pauVar93 = auVar124;
                    pauVar95 = pauVar95 + 1;
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pauVar93 = pauVar93 + 1;
                    uVar77 = (int)pMVar79 - 1;
                    pMVar79 = (Mat *)(ulong)uVar77;
                    auVar164 = in_ZMM5;
                  } while (uVar77 != 0);
                }
                if (local_162 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])*pauVar95;
                    afStack_b8 = *(float (*) [2])(*pauVar95 + 8);
                    afStack_b0 = *(float (*) [2])(*pauVar95 + 0x10);
                    afStack_a8 = *(float (*) [2])(*pauVar95 + 0x18);
                    fVar130 = *(float *)ppvVar84;
                    auVar146._4_4_ = fVar130;
                    auVar146._0_4_ = fVar130;
                    auVar146._8_4_ = fVar130;
                    auVar146._12_4_ = fVar130;
                    auVar146._16_4_ = fVar130;
                    auVar146._20_4_ = fVar130;
                    auVar146._24_4_ = fVar130;
                    auVar146._28_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    local_100[4] = fVar130;
                    local_100[5] = fVar130;
                    local_100[6] = fVar130;
                    local_100[7] = fVar130;
                    pMVar79 = (Mat *)BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                                               (&local_164,(__m256 *)local_c0,(__m256 *)local_100);
                    *(undefined1 (*) [32])*pauVar93 = auVar146;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x20);
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x20);
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                  } while (uVar77 != 0);
                }
                if (local_163 == '\0') {
                  uVar80 = uVar82 & 0xffffffff;
                  do {
                    local_c0 = *(float (*) [2])*pauVar95;
                    afStack_b8 = *(float (*) [2])(*pauVar95 + 8);
                    fVar130 = *(float *)ppvVar84;
                    auVar133._4_4_ = fVar130;
                    auVar133._0_4_ = fVar130;
                    auVar133._8_4_ = fVar130;
                    auVar133._12_4_ = fVar130;
                    local_100[0] = fVar130;
                    local_100[1] = fVar130;
                    local_100[2] = fVar130;
                    local_100[3] = fVar130;
                    auVar155 = ZEXT856(auVar133._8_8_);
                    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                    afVar165 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                         (&local_164,(__m128 *)local_c0,(__m128 *)local_100);
                    auVar101._0_8_ = afVar165._0_8_;
                    auVar101._8_56_ = auVar155;
                    *(undefined1 (*) [16])*pauVar93 = auVar101._0_16_;
                    pauVar95 = (undefined1 (*) [64])(*pauVar95 + 0x10);
                    ppvVar84 = (void **)((long)ppvVar84 + 4);
                    pauVar93 = (undefined1 (*) [64])((long)*pauVar93 + 0x10);
                    uVar77 = (int)uVar80 - 1;
                    uVar80 = (ulong)uVar77;
                    pMVar79 = extraout_RAX;
                  } while (uVar77 != 0);
                }
                if ((char)local_134 == '\0') {
                  lVar92 = 0;
                  lVar90 = 0;
                  do {
                    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                    fVar130 = atan2f(*(float *)((long)ppvVar84 + lVar90 * 4),
                                     *(float *)(*pauVar95 + lVar90 * 4));
                    *(float *)((long)*pauVar93 + lVar90 * 4) = fVar130;
                    lVar90 = lVar90 + 1;
                    lVar92 = lVar92 + -4;
                  } while ((int)local_160 != (int)lVar90);
                  pauVar93 = (undefined1 (*) [64])((long)pauVar93 - lVar92);
                  pauVar95 = (undefined1 (*) [64])((long)pauVar95 - lVar92);
                  pMVar79 = extraout_RAX_00;
                  uVar82 = local_160;
                }
                iVar78 = (int)local_140 + 1;
                auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar100 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
                auVar101 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar102 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                auVar103 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar104 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
                auVar105 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
                auVar106 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
                auVar107 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
                auVar108 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
                auVar109 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
                auVar110 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
                auVar111 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
                auVar112 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
                auVar113 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
                auVar114 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
              } while (iVar78 != (int)local_150);
            }
            local_10c = local_10c + 1;
          } while (local_10c != local_11c);
        }
        in_EAX = (int)pMVar79;
        local_118 = local_118 + 1;
      } while (local_118 != local_108);
    }
  }
  return in_EAX;
}

Assistant:

static int binary_op_broadcast_outer(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    using namespace BinaryOp_x86_avx512_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_broadcast_outer<binary_op_add>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_broadcast_outer<binary_op_sub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_broadcast_outer<binary_op_mul>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_broadcast_outer<binary_op_div>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_broadcast_outer<binary_op_max>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_broadcast_outer<binary_op_min>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_broadcast_outer<binary_op_pow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_broadcast_outer<binary_op_rsub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_broadcast_outer<binary_op_rdiv>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_broadcast_outer<binary_op_rpow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_broadcast_outer<binary_op_atan2>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_broadcast_outer<binary_op_ratan2>(a, b, c, opt);

    // should never reach here
    return 0;
}